

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixmake.cpp
# Opt level: O0

int __thiscall UnixMakefileGenerator::init(UnixMakefileGenerator *this,EVP_PKEY_CTX *ctx)

{
  FILE *__stream;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  QList<ProString> *pQVar10;
  qsizetype qVar11;
  ulong uVar12;
  EVP_PKEY_CTX *pEVar13;
  long in_FS_OFFSET;
  QStringBuilder<QString_&,_char> QVar14;
  int slsh;
  ProString *arch_1;
  ProStringList *__range5;
  ProString *arch;
  ProStringList *__range4;
  ProString *compiler;
  ProStringList *__range1_1;
  int i_2;
  ProStringList *rpathdirs_1;
  int i_1;
  ProStringList *rpathdirs;
  ProStringList *qmklibspost;
  ProStringList *qmklibs;
  int i;
  ProStringList *fwdirs;
  ProString *iif;
  ProStringList *__range1;
  ProStringList *configs;
  ProString target;
  ProString bundle;
  ProKey runCompImp;
  ProKey runComp;
  ProString compilerVariable;
  QString compilerExecutable;
  QString file;
  const_iterator __end5;
  const_iterator __begin5;
  ProStringList pchArchs_1;
  ProString language;
  QString headerSuffix;
  QString suffix;
  const_iterator __end4;
  const_iterator __begin4;
  ProStringList pchArchs;
  QString pchBaseName;
  QString pchFlags;
  QString compile_flag;
  iterator __end1_1;
  iterator __begin1_1;
  QString rpathbase;
  QString rpathdir;
  ProStringList ldaddpost;
  ProStringList ldadd;
  iterator __end1;
  iterator __begin1;
  QString sroot;
  QStringList l;
  QMakeProject *in_stack_ffffffffffffc7f8;
  QMakeProject *t;
  QMakeProject *in_stack_ffffffffffffc800;
  QMakeProject *pQVar15;
  QMakeProject *in_stack_ffffffffffffc808;
  QMakeProject *in_stack_ffffffffffffc810;
  QMakeProject *in_stack_ffffffffffffc818;
  QMakeProject *in_stack_ffffffffffffc820;
  QStringBuilder<const_char_(&)[2],_QString_&> *in_stack_ffffffffffffc828;
  CaseSensitivity cs;
  MakefileGenerator *in_stack_ffffffffffffc830;
  ProString *in_stack_ffffffffffffc838;
  ProKey *in_stack_ffffffffffffc858;
  undefined7 in_stack_ffffffffffffc860;
  undefined1 in_stack_ffffffffffffc867;
  undefined8 in_stack_ffffffffffffc8a0;
  QString *in_stack_ffffffffffffc8a8;
  undefined7 in_stack_ffffffffffffc8b0;
  undefined1 in_stack_ffffffffffffc8b7;
  bool local_36e1;
  bool local_36d1;
  bool local_36b1;
  bool local_3641;
  byte local_35f2;
  bool local_35d9;
  bool local_35c1;
  byte local_35a9;
  byte local_3599;
  byte local_3509;
  byte local_34b9;
  byte local_3442;
  bool local_3441;
  byte local_33e9;
  bool local_32e1;
  QFlagsStorage<MakefileGenerator::FileFixifyType> in_stack_ffffffffffffcd5c;
  bool local_3279;
  bool local_3269;
  bool local_31c1;
  byte local_30a1;
  bool local_309a;
  int local_3054;
  int local_3044;
  int local_301c;
  bool local_3007;
  int local_3004;
  bool local_2feb;
  ProString local_2f78 [7];
  UnixMakefileGenerator *in_stack_ffffffffffffd1f8;
  ProString local_2378 [4];
  undefined1 local_22b8 [48];
  undefined1 local_2288 [24];
  QStringBuilder<QString_&,_const_char_(&)[2]> local_2270;
  QStringBuilder<const_char_(&)[11],_ProString_&> local_2180;
  undefined1 local_2158 [48];
  undefined1 local_2128 [48];
  undefined1 local_20f8 [24];
  QStringBuilder<QString_&,_const_char_(&)[2]> local_20e0;
  QStringBuilder<const_char_(&)[11],_ProString_&> local_1ff0;
  undefined1 local_1fe0 [96];
  undefined1 local_1f80 [48];
  undefined8 local_1f50;
  undefined8 local_1f48;
  undefined8 local_1f40;
  QStringBuilder<const_char_(&)[2],_QString_&> local_1f38;
  undefined1 local_1f28 [31];
  QLatin1Char local_1f09 [41];
  undefined1 local_1ee0 [104];
  QString *local_1e78;
  undefined8 local_1e70;
  QStringBuilder<QString_&,_ProString_&> local_1e68;
  undefined8 local_1e40;
  undefined8 local_1e38;
  undefined8 local_1e30;
  ProString *local_1e28;
  const_iterator local_1e20;
  const_iterator local_1e18 [7];
  undefined8 local_1de0;
  undefined8 local_1dd8;
  undefined8 local_1dd0;
  QStringBuilder<QString_&,_ProString_&> local_1dc8;
  QString *local_1d88;
  undefined8 local_1d80;
  QStringBuilder<const_char_(&)[16],_const_ProString_&> local_1d78;
  ProString local_1d38 [6];
  undefined8 local_1c00;
  undefined8 local_1bf8;
  undefined8 local_1bf0;
  QStringBuilder<QString_&,_QString_&> local_1be8;
  undefined1 local_1bd8 [31];
  QLatin1Char local_1bb9 [41];
  undefined1 local_1b90 [48];
  QString *local_1b60;
  undefined8 local_1b58;
  undefined8 local_1af0;
  undefined8 local_1ae8;
  undefined8 local_1ae0;
  ProString *local_1ad8;
  const_iterator local_1ad0;
  const_iterator local_1ac8 [7];
  undefined8 local_1a90;
  undefined8 local_1a88;
  undefined8 local_1a80;
  QString *local_19c8;
  undefined8 local_19c0;
  undefined1 local_19a0 [24];
  QString *local_1988;
  undefined8 local_1980;
  undefined1 local_1918 [24];
  undefined1 local_1900 [24];
  QString *local_18e8;
  undefined8 local_18e0;
  undefined8 local_17a0;
  undefined8 local_1798;
  undefined8 local_1790;
  QStringBuilder<const_char_(&)[7],_const_ProString_&> local_1788;
  undefined1 local_1760 [48];
  undefined8 local_1730;
  undefined8 local_1728;
  undefined8 local_1720;
  undefined1 local_16e8 [48];
  undefined8 local_16b8;
  undefined8 local_16b0;
  undefined8 local_16a8;
  ProString *local_16a0;
  iterator local_1698;
  iterator local_1690 [28];
  EVP_PKEY_CTX local_15b0 [48];
  EVP_PKEY_CTX local_1580 [72];
  undefined1 local_1538 [24];
  QFileInfo local_1520 [8];
  undefined1 local_1518 [24];
  undefined1 local_1500 [24];
  undefined1 local_14e8 [48];
  undefined1 local_14b8 [312];
  undefined1 local_1380 [24];
  undefined1 local_1368 [48];
  undefined1 local_1338 [216];
  QString *local_1260;
  char local_1258;
  undefined1 local_1249;
  char *local_1230;
  QChar local_120a [61];
  undefined8 local_1190;
  undefined8 local_1188;
  undefined8 local_1180;
  QFileInfo local_1160 [14];
  QChar local_1152 [13];
  QChar local_1138;
  char16_t local_1136;
  QChar local_1134;
  char16_t local_1132;
  QString local_1130 [30];
  undefined8 local_e58;
  undefined8 local_e50;
  undefined8 local_e48;
  undefined8 local_dc8;
  undefined8 local_dc0;
  undefined8 local_db8;
  QLatin1Char local_63d [3];
  char16_t local_63a;
  ProString *local_620;
  iterator local_618;
  iterator local_610 [7];
  QString local_5d8 [15];
  QChar local_46a [49];
  undefined1 local_408 [24];
  undefined8 local_3f0;
  undefined8 local_3e8;
  undefined8 local_3e0;
  QString *local_18;
  char local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
  QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
  ProKey::~ProKey((ProKey *)0x1eb113);
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
  bVar1 = QMakeProject::isEmpty(in_stack_ffffffffffffc818,(ProKey *)in_stack_ffffffffffffc810);
  local_30a1 = 0;
  if (bVar1) {
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
    bVar1 = QMakeProject::isEmpty(in_stack_ffffffffffffc818,(ProKey *)in_stack_ffffffffffffc810);
    local_30a1 = bVar1 ^ 0xff;
    ProKey::~ProKey((ProKey *)0x1eb1f5);
  }
  ProKey::~ProKey((ProKey *)0x1eb202);
  if ((local_30a1 & 1) != 0) {
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
    QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
    QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
    ProStringList::operator=
              ((ProStringList *)in_stack_ffffffffffffc800,(ProStringList *)in_stack_ffffffffffffc7f8
              );
    ProKey::~ProKey((ProKey *)0x1eb2ba);
    ProKey::~ProKey((ProKey *)0x1eb2c7);
  }
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
  bVar1 = QMakeProject::isEmpty(in_stack_ffffffffffffc818,(ProKey *)in_stack_ffffffffffffc810);
  ProKey::~ProKey((ProKey *)0x1eb31b);
  if (bVar1) {
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
    QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
    QMakeEvaluator::first
              (&in_stack_ffffffffffffc818->super_QMakeEvaluator,(ProKey *)in_stack_ffffffffffffc810)
    ;
    QList<ProString>::append
              ((QList<ProString> *)in_stack_ffffffffffffc800,(rvalue_ref)in_stack_ffffffffffffc7f8);
    ProString::~ProString((ProString *)0x1eb3e0);
    ProKey::~ProKey((ProKey *)0x1eb3ed);
    ProKey::~ProKey((ProKey *)0x1eb3fa);
  }
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
  QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
  QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
  ProStringList::operator=
            ((ProStringList *)in_stack_ffffffffffffc800,(ProStringList *)in_stack_ffffffffffffc7f8);
  ProKey::~ProKey((ProKey *)0x1eb4a2);
  ProKey::~ProKey((ProKey *)0x1eb4af);
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
  bVar1 = QMakeProject::isEmpty(in_stack_ffffffffffffc818,(ProKey *)in_stack_ffffffffffffc810);
  ProKey::~ProKey((ProKey *)0x1eb503);
  if (bVar1) {
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
    QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
    bVar1 = QMakeProject::isEmpty(in_stack_ffffffffffffc818,(ProKey *)in_stack_ffffffffffffc810);
    if (bVar1) {
      QString::QString((QString *)in_stack_ffffffffffffc808,(char *)in_stack_ffffffffffffc838);
      ProString::ProString
                ((ProString *)in_stack_ffffffffffffc800,(QString *)in_stack_ffffffffffffc7f8);
    }
    else {
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
      QMakeEvaluator::first
                (&in_stack_ffffffffffffc818->super_QMakeEvaluator,
                 (ProKey *)in_stack_ffffffffffffc810);
    }
    ::operator+((char (*) [5])in_stack_ffffffffffffc808,(ProString *)in_stack_ffffffffffffc800);
    ProString::ProString<char_const(&)[5],ProString>
              ((ProString *)in_stack_ffffffffffffc810,
               (QStringBuilder<const_char_(&)[5],_ProString> *)in_stack_ffffffffffffc808);
    QList<ProString>::append
              ((QList<ProString> *)in_stack_ffffffffffffc800,(rvalue_ref)in_stack_ffffffffffffc7f8);
    ProString::~ProString((ProString *)0x1eb68a);
    QStringBuilder<const_char_(&)[5],_ProString>::~QStringBuilder
              ((QStringBuilder<const_char_(&)[5],_ProString> *)0x1eb697);
    ProString::~ProString((ProString *)0x1eb6a4);
    if (bVar1) {
      QString::~QString((QString *)0x1eb6d6);
    }
    else {
      ProKey::~ProKey((ProKey *)0x1eb6bd);
    }
    ProKey::~ProKey((ProKey *)0x1eb6e3);
    ProKey::~ProKey((ProKey *)0x1eb6f0);
  }
  local_3f0 = 0xaaaaaaaaaaaaaaaa;
  local_3e8 = 0xaaaaaaaaaaaaaaaa;
  local_3e0 = 0xaaaaaaaaaaaaaaaa;
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
  QMakeEvaluator::first
            (&in_stack_ffffffffffffc818->super_QMakeEvaluator,(ProKey *)in_stack_ffffffffffffc810);
  ProString::toQString((ProString *)in_stack_ffffffffffffc7f8);
  QChar::QChar<char,_true>(local_46a,'.');
  QFlags<Qt::SplitBehaviorFlags>::QFlags
            ((QFlags<Qt::SplitBehaviorFlags> *)in_stack_ffffffffffffc800,
             (SplitBehaviorFlags)((ulong)in_stack_ffffffffffffc7f8 >> 0x20));
  QString::split((QChar)(char16_t)&local_3f0,(QFlags_conflict *)local_408,
                 (uint)(ushort)local_46a[0].ucs);
  QString::~QString((QString *)0x1eb7d5);
  ProString::~ProString((ProString *)0x1eb7e2);
  ProKey::~ProKey((ProKey *)0x1eb7ef);
  QString::QString((QString *)in_stack_ffffffffffffc808,(char *)in_stack_ffffffffffffc838);
  QList<QString>::operator<<
            ((QList<QString> *)in_stack_ffffffffffffc800,(rvalue_ref)in_stack_ffffffffffffc7f8);
  QString::QString((QString *)in_stack_ffffffffffffc808,(char *)in_stack_ffffffffffffc838);
  QList<QString>::operator<<
            ((QList<QString> *)in_stack_ffffffffffffc800,(rvalue_ref)in_stack_ffffffffffffc7f8);
  QString::~QString((QString *)0x1eb856);
  QString::~QString((QString *)0x1eb863);
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
  QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
  QList<QString>::operator[]
            ((QList<QString> *)in_stack_ffffffffffffc800,(qsizetype)in_stack_ffffffffffffc7f8);
  ProString::ProString((ProString *)in_stack_ffffffffffffc800,(QString *)in_stack_ffffffffffffc7f8);
  QList<ProString>::append
            ((QList<ProString> *)in_stack_ffffffffffffc800,(rvalue_ref)in_stack_ffffffffffffc7f8);
  ProString::~ProString((ProString *)0x1eb8ee);
  ProKey::~ProKey((ProKey *)0x1eb8fb);
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
  QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
  QList<QString>::operator[]
            ((QList<QString> *)in_stack_ffffffffffffc800,(qsizetype)in_stack_ffffffffffffc7f8);
  ProString::ProString((ProString *)in_stack_ffffffffffffc800,(QString *)in_stack_ffffffffffffc7f8);
  QList<ProString>::append
            ((QList<ProString> *)in_stack_ffffffffffffc800,(rvalue_ref)in_stack_ffffffffffffc7f8);
  ProString::~ProString((ProString *)0x1eb987);
  ProKey::~ProKey((ProKey *)0x1eb994);
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
  QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
  QList<QString>::operator[]
            ((QList<QString> *)in_stack_ffffffffffffc800,(qsizetype)in_stack_ffffffffffffc7f8);
  ProString::ProString((ProString *)in_stack_ffffffffffffc800,(QString *)in_stack_ffffffffffffc7f8);
  QList<ProString>::append
            ((QList<ProString> *)in_stack_ffffffffffffc800,(rvalue_ref)in_stack_ffffffffffffc7f8);
  ProString::~ProString((ProString *)0x1eba20);
  ProKey::~ProKey((ProKey *)0x1eba2d);
  local_5d8[0].d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_5d8[0].d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_5d8[0].d.size = -0x5555555555555556;
  QMakeProject::sourceRoot(in_stack_ffffffffffffc818);
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
  QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
  ProKey::~ProKey((ProKey *)0x1ebadd);
  local_610[0].i = (ProString *)0xaaaaaaaaaaaaaaaa;
  local_610[0] = QList<ProString>::begin((QList<ProString> *)in_stack_ffffffffffffc800);
  local_618.i = (ProString *)0xaaaaaaaaaaaaaaaa;
  local_618 = QList<ProString>::end((QList<ProString> *)in_stack_ffffffffffffc800);
  while( true ) {
    local_620 = local_618.i;
    bVar1 = QList<ProString>::iterator::operator!=(local_610,local_618);
    if (!bVar1) break;
    QList<ProString>::iterator::operator*(local_610);
    QMakeProject::cacheFile(in_stack_ffffffffffffc7f8);
    bVar1 = ProString::operator==
                      ((ProString *)in_stack_ffffffffffffc820,(QString *)in_stack_ffffffffffffc818);
    QString::~QString((QString *)0x1ebbe2);
    if (!bVar1) {
      bVar1 = ProString::startsWith
                        ((ProString *)in_stack_ffffffffffffc810,(QString *)in_stack_ffffffffffffc808
                         ,(CaseSensitivity)((ulong)in_stack_ffffffffffffc800 >> 0x20));
      local_31c1 = false;
      if (bVar1) {
        QString::size(local_5d8);
        local_63a = (char16_t)
                    ProString::at((ProString *)in_stack_ffffffffffffc800,
                                  (int)((ulong)in_stack_ffffffffffffc7f8 >> 0x20));
        QLatin1Char::QLatin1Char(local_63d,'/');
        QChar::QChar<QLatin1Char,_true>
                  ((QChar *)in_stack_ffffffffffffc800,
                   (QLatin1Char)(char)((ulong)in_stack_ffffffffffffc808 >> 0x38));
        local_31c1 = ::operator==((QChar *)in_stack_ffffffffffffc800,
                                  (QChar *)in_stack_ffffffffffffc7f8);
      }
      if (local_31c1 != false) {
        ProString::toQString((ProString *)in_stack_ffffffffffffc7f8);
        QFlags<MakefileGenerator::FileFixifyType>::QFlags
                  ((QFlags<MakefileGenerator::FileFixifyType> *)in_stack_ffffffffffffc800,
                   (FileFixifyType)((ulong)in_stack_ffffffffffffc7f8 >> 0x20));
        MakefileGenerator::fileFixify
                  ((MakefileGenerator *)
                   CONCAT17(in_stack_ffffffffffffc8b7,in_stack_ffffffffffffc8b0),
                   in_stack_ffffffffffffc8a8,(FileFixifyTypes)in_stack_ffffffffffffcd5c.i,
                   SUB81((ulong)in_stack_ffffffffffffc8a0 >> 0x38,0));
        ProString::ProString
                  ((ProString *)in_stack_ffffffffffffc800,(QString *)in_stack_ffffffffffffc7f8);
        ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
        QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
        QList<ProString>::operator+=
                  ((QList<ProString> *)in_stack_ffffffffffffc800,
                   (rvalue_ref)in_stack_ffffffffffffc7f8);
        ProKey::~ProKey((ProKey *)0x1ebd6a);
        ProString::~ProString((ProString *)0x1ebd77);
        QString::~QString((QString *)0x1ebd84);
        QString::~QString((QString *)0x1ebd91);
      }
    }
    QList<ProString>::iterator::operator++(local_610);
  }
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
  QMakeEvaluator::first
            (&in_stack_ffffffffffffc818->super_QMakeEvaluator,(ProKey *)in_stack_ffffffffffffc810);
  bVar1 = ProString::operator==
                    ((ProString *)in_stack_ffffffffffffc820,(char *)in_stack_ffffffffffffc818);
  ProString::~ProString((ProString *)0x1ebe15);
  ProKey::~ProKey((ProKey *)0x1ebe22);
  if (bVar1) {
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
    QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
    ProString::ProString((ProString *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc818);
    QList<ProString>::append
              ((QList<ProString> *)in_stack_ffffffffffffc800,(rvalue_ref)in_stack_ffffffffffffc7f8);
    ProString::~ProString((ProString *)0x1ebeb0);
    ProKey::~ProKey((ProKey *)0x1ebebd);
  }
  else {
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
    QMakeEvaluator::first
              (&in_stack_ffffffffffffc818->super_QMakeEvaluator,(ProKey *)in_stack_ffffffffffffc810)
    ;
    bVar1 = ProString::operator==
                      ((ProString *)in_stack_ffffffffffffc820,(char *)in_stack_ffffffffffffc818);
    ProString::~ProString((ProString *)0x1ebf32);
    ProKey::~ProKey((ProKey *)0x1ebf3f);
    if (bVar1) {
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
      QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
      ProString::ProString((ProString *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc818)
      ;
      QList<ProString>::append
                ((QList<ProString> *)in_stack_ffffffffffffc800,(rvalue_ref)in_stack_ffffffffffffc7f8
                );
      ProString::~ProString((ProString *)0x1ebfcd);
      ProKey::~ProKey((ProKey *)0x1ebfda);
    }
    else {
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
      QMakeEvaluator::first
                (&in_stack_ffffffffffffc818->super_QMakeEvaluator,
                 (ProKey *)in_stack_ffffffffffffc810);
      pEVar13 = (EVP_PKEY_CTX *)0x34cb02;
      bVar1 = ProString::operator==
                        ((ProString *)in_stack_ffffffffffffc820,(char *)in_stack_ffffffffffffc818);
      ProString::~ProString((ProString *)0x1ec04f);
      ProKey::~ProKey((ProKey *)0x1ec05c);
      if (bVar1) {
        MakefileGenerator::init(&this->super_MakefileGenerator,pEVar13);
        ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
        bVar1 = QMakeProject::isEmpty(in_stack_ffffffffffffc818,(ProKey *)in_stack_ffffffffffffc810)
        ;
        ProKey::~ProKey((ProKey *)0x1ec0cd);
        if (bVar1) {
          ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
          QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
          ProString::ProString
                    ((ProString *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc818);
          QList<ProString>::append
                    ((QList<ProString> *)in_stack_ffffffffffffc800,
                     (rvalue_ref)in_stack_ffffffffffffc7f8);
          ProString::~ProString((ProString *)0x1ec15b);
          ProKey::~ProKey((ProKey *)0x1ec168);
        }
        goto LAB_001f1017;
      }
    }
  }
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
  QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
  QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
  ProStringList::operator=
            ((ProStringList *)in_stack_ffffffffffffc800,(ProStringList *)in_stack_ffffffffffffc7f8);
  ProKey::~ProKey((ProKey *)0x1ec224);
  ProKey::~ProKey((ProKey *)0x1ec231);
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
  bVar2 = QMakeProject::isEmpty(in_stack_ffffffffffffc818,(ProKey *)in_stack_ffffffffffffc810);
  bVar3 = false;
  bVar1 = false;
  local_3007 = false;
  if (bVar2) {
LAB_001ec2ec:
    QString::QString((QString *)in_stack_ffffffffffffc808,(char *)in_stack_ffffffffffffc838);
    bVar1 = true;
    local_3007 = QMakeProject::isActiveConfig
                           (in_stack_ffffffffffffc808,(QString *)in_stack_ffffffffffffc800,
                            SUB81((ulong)in_stack_ffffffffffffc7f8 >> 0x38,0));
    local_3279 = false;
    if (local_3007) {
      QString::QString((QString *)in_stack_ffffffffffffc808,(char *)in_stack_ffffffffffffc838);
      local_3279 = QMakeProject::isActiveConfig
                             (in_stack_ffffffffffffc808,(QString *)in_stack_ffffffffffffc800,
                              SUB81((ulong)in_stack_ffffffffffffc7f8 >> 0x38,0));
    }
    local_3269 = local_3279;
  }
  else {
    QString::QString((QString *)in_stack_ffffffffffffc808,(char *)in_stack_ffffffffffffc838);
    bVar3 = true;
    bVar2 = QMakeProject::isActiveConfig
                      (in_stack_ffffffffffffc808,(QString *)in_stack_ffffffffffffc800,
                       SUB81((ulong)in_stack_ffffffffffffc7f8 >> 0x38,0));
    local_3269 = true;
    if (bVar2) goto LAB_001ec2ec;
  }
  if (local_3007 != false) {
    QString::~QString((QString *)0x1ec3ce);
  }
  if (bVar1) {
    QString::~QString((QString *)0x1ec3e7);
  }
  if (bVar3) {
    QString::~QString((QString *)0x1ec400);
  }
  ProKey::~ProKey((ProKey *)0x1ec40d);
  if (local_3269 == false) {
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
    bVar3 = QMakeProject::isEmpty(in_stack_ffffffffffffc818,(ProKey *)in_stack_ffffffffffffc810);
    bVar1 = true;
    if (bVar3) {
      QString::QString((QString *)in_stack_ffffffffffffc808,(char *)in_stack_ffffffffffffc838);
      bVar1 = QMakeProject::isActiveConfig
                        (in_stack_ffffffffffffc808,(QString *)in_stack_ffffffffffffc800,
                         SUB81((ulong)in_stack_ffffffffffffc7f8 >> 0x38,0));
      QString::~QString((QString *)0x1ec555);
    }
    ProKey::~ProKey((ProKey *)0x1ec562);
    if (bVar1 != false) {
      ProStringList::removeAll
                ((ProStringList *)in_stack_ffffffffffffc810,(char *)in_stack_ffffffffffffc808);
    }
  }
  else {
    qVar11 = QListSpecialMethodsBase<ProString>::indexOf<char[4]>
                       ((QListSpecialMethodsBase<ProString> *)in_stack_ffffffffffffc800,
                        (char (*) [4])in_stack_ffffffffffffc7f8,0x1ec432);
    if (qVar11 == -1) {
      ProString::ProString((ProString *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc818)
      ;
      QList<ProString>::append
                ((QList<ProString> *)in_stack_ffffffffffffc800,(rvalue_ref)in_stack_ffffffffffffc7f8
                );
      ProString::~ProString((ProString *)0x1ec47e);
    }
  }
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
  bVar1 = QMakeProject::isEmpty(in_stack_ffffffffffffc818,(ProKey *)in_stack_ffffffffffffc810);
  ProKey::~ProKey((ProKey *)0x1ec5db);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
    bVar2 = QMakeProject::isEmpty(in_stack_ffffffffffffc818,(ProKey *)in_stack_ffffffffffffc810);
    bVar3 = false;
    bVar1 = false;
    local_32e1 = false;
    if (!bVar2) {
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
      bVar3 = true;
      QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
      bVar2 = QList<ProString>::isEmpty((QList<ProString> *)0x1ec759);
      local_32e1 = false;
      if (!bVar2) {
        QString::QString((QString *)in_stack_ffffffffffffc808,(char *)in_stack_ffffffffffffc838);
        bVar1 = true;
        local_32e1 = QMakeProject::isActiveConfig
                               (in_stack_ffffffffffffc808,(QString *)in_stack_ffffffffffffc800,
                                SUB81((ulong)in_stack_ffffffffffffc7f8 >> 0x38,0));
      }
    }
    if (bVar1) {
      QString::~QString((QString *)0x1ec7e1);
    }
    if (bVar3) {
      ProKey::~ProKey((ProKey *)0x1ec7fa);
    }
    ProKey::~ProKey((ProKey *)0x1ec807);
    if (local_32e1 != false) {
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
      QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
      QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
      QList<ProString>::operator+=
                ((QList<ProString> *)in_stack_ffffffffffffc800,
                 (QList<ProString> *)in_stack_ffffffffffffc7f8);
      ProKey::~ProKey((ProKey *)0x1ec8bf);
      ProKey::~ProKey((ProKey *)0x1ec8cc);
    }
  }
  else {
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
    QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
    QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
    QList<ProString>::operator+=
              ((QList<ProString> *)in_stack_ffffffffffffc800,
               (QList<ProString> *)in_stack_ffffffffffffc7f8);
    ProKey::~ProKey((ProKey *)0x1ec693);
    ProKey::~ProKey((ProKey *)0x1ec6a0);
  }
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
  QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
  QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
  QList<ProString>::operator+=
            ((QList<ProString> *)in_stack_ffffffffffffc800,
             (QList<ProString> *)in_stack_ffffffffffffc7f8);
  ProKey::~ProKey((ProKey *)0x1ec976);
  ProKey::~ProKey((ProKey *)0x1ec983);
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
  QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
  QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
  QList<ProString>::operator+=
            ((QList<ProString> *)in_stack_ffffffffffffc800,
             (QList<ProString> *)in_stack_ffffffffffffc7f8);
  ProKey::~ProKey((ProKey *)0x1eca2b);
  ProKey::~ProKey((ProKey *)0x1eca38);
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
  QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
  QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
  QList<ProString>::operator+=
            ((QList<ProString> *)in_stack_ffffffffffffc800,
             (QList<ProString> *)in_stack_ffffffffffffc7f8);
  ProKey::~ProKey((ProKey *)0x1ecae0);
  ProKey::~ProKey((ProKey *)0x1ecaed);
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
  bVar1 = QMakeProject::isEmpty(in_stack_ffffffffffffc818,(ProKey *)in_stack_ffffffffffffc810);
  ProKey::~ProKey((ProKey *)0x1ecb43);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
    QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
    QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
    QList<ProString>::operator+=
              ((QList<ProString> *)in_stack_ffffffffffffc800,
               (QList<ProString> *)in_stack_ffffffffffffc7f8);
    ProKey::~ProKey((ProKey *)0x1ecbfb);
    ProKey::~ProKey((ProKey *)0x1ecc08);
  }
  local_dc8 = 0xaaaaaaaaaaaaaaaa;
  local_dc0 = 0xaaaaaaaaaaaaaaaa;
  local_db8 = 0xaaaaaaaaaaaaaaaa;
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
  QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
  libdirToFlags((UnixMakefileGenerator *)
                CONCAT17(in_stack_ffffffffffffc867,in_stack_ffffffffffffc860),
                in_stack_ffffffffffffc858);
  ::operator+((ProStringList *)in_stack_ffffffffffffc818,(ProStringList *)in_stack_ffffffffffffc810)
  ;
  ProStringList::~ProStringList((ProStringList *)0x1eccd8);
  ProKey::~ProKey((ProKey *)0x1ecce5);
  ProKey::~ProKey((ProKey *)0x1eccf2);
  local_e58 = 0xaaaaaaaaaaaaaaaa;
  local_e50 = 0xaaaaaaaaaaaaaaaa;
  local_e48 = 0xaaaaaaaaaaaaaaaa;
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
  libdirToFlags((UnixMakefileGenerator *)
                CONCAT17(in_stack_ffffffffffffc867,in_stack_ffffffffffffc860),
                in_stack_ffffffffffffc858);
  ProKey::~ProKey((ProKey *)0x1ecd5d);
  QString::QString((QString *)in_stack_ffffffffffffc808,(char *)in_stack_ffffffffffffc838);
  bVar1 = QMakeProject::isActiveConfig
                    (in_stack_ffffffffffffc808,(QString *)in_stack_ffffffffffffc800,
                     SUB81((ulong)in_stack_ffffffffffffc7f8 >> 0x38,0));
  QString::~QString((QString *)0x1ecdb3);
  if (bVar1) {
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
    bVar1 = QMakeProject::isEmpty(in_stack_ffffffffffffc818,(ProKey *)in_stack_ffffffffffffc810);
    ProKey::~ProKey((ProKey *)0x1ece19);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
      pQVar10 = &QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8)
                 ->super_QList<ProString>;
      ProKey::~ProKey((ProKey *)0x1ece90);
      for (local_301c = 0; qVar11 = QList<ProString>::size(pQVar10), local_301c < qVar11;
          local_301c = local_301c + 1) {
        QList<ProString>::operator[]
                  ((QList<ProString> *)in_stack_ffffffffffffc800,
                   (qsizetype)in_stack_ffffffffffffc7f8);
        MakefileGenerator::escapeFilePath
                  ((MakefileGenerator *)in_stack_ffffffffffffc820,
                   (ProString *)in_stack_ffffffffffffc818);
        ::operator+((char (*) [3])in_stack_ffffffffffffc808,(ProString *)in_stack_ffffffffffffc800);
        ProString::ProString<char_const(&)[3],ProString>
                  ((ProString *)in_stack_ffffffffffffc810,
                   (QStringBuilder<const_char_(&)[3],_ProString> *)in_stack_ffffffffffffc808);
        ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
        QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
        QList<ProString>::operator+=
                  ((QList<ProString> *)in_stack_ffffffffffffc800,
                   (rvalue_ref)in_stack_ffffffffffffc7f8);
        ProKey::~ProKey((ProKey *)0x1ecf97);
        ProString::~ProString((ProString *)0x1ecfa4);
        QStringBuilder<const_char_(&)[3],_ProString>::~QStringBuilder
                  ((QStringBuilder<const_char_(&)[3],_ProString> *)0x1ecfb1);
        ProString::~ProString((ProString *)0x1ecfbe);
      }
    }
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
    QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
    QList<ProString>::operator+=
              ((QList<ProString> *)in_stack_ffffffffffffc800,
               (QList<ProString> *)in_stack_ffffffffffffc7f8);
    ProKey::~ProKey((ProKey *)0x1ed033);
  }
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
  QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
  ProKey::~ProKey((ProKey *)0x1ed09a);
  ::operator+((ProStringList *)in_stack_ffffffffffffc818,(ProStringList *)in_stack_ffffffffffffc810)
  ;
  ProStringList::operator=
            ((ProStringList *)in_stack_ffffffffffffc800,(ProStringList *)in_stack_ffffffffffffc7f8);
  ProStringList::~ProStringList((ProStringList *)0x1ed0e9);
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
  QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
  ProKey::~ProKey((ProKey *)0x1ed150);
  ::operator+((ProStringList *)in_stack_ffffffffffffc818,(ProStringList *)in_stack_ffffffffffffc810)
  ;
  ProStringList::operator=
            ((ProStringList *)in_stack_ffffffffffffc800,(ProStringList *)in_stack_ffffffffffffc7f8);
  ProStringList::~ProStringList((ProStringList *)0x1ed19f);
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
  bVar1 = QMakeProject::isEmpty(in_stack_ffffffffffffc818,(ProKey *)in_stack_ffffffffffffc810);
  local_33e9 = 0;
  if (!bVar1) {
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
    bVar1 = QMakeProject::isEmpty(in_stack_ffffffffffffc818,(ProKey *)in_stack_ffffffffffffc810);
    local_33e9 = bVar1 ^ 0xff;
    ProKey::~ProKey((ProKey *)0x1ed26f);
  }
  ProKey::~ProKey((ProKey *)0x1ed27c);
  if ((local_33e9 & 1) != 0) {
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
    pQVar10 = &QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8)->
               super_QList<ProString>;
    ProKey::~ProKey((ProKey *)0x1ed2f3);
    for (local_3044 = 0; qVar11 = QList<ProString>::size(pQVar10), local_3044 < qVar11;
        local_3044 = local_3044 + 1) {
      local_1130[0].d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_1130[0].d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      local_1130[0].d.size = -0x5555555555555556;
      QList<ProString>::operator[]
                ((QList<ProString> *)in_stack_ffffffffffffc800,(qsizetype)in_stack_ffffffffffffc7f8)
      ;
      ProString::toQString((ProString *)in_stack_ffffffffffffc7f8);
      qVar11 = QString::size(local_1130);
      local_3441 = false;
      if (1 < qVar11) {
        local_1132 = (char16_t)
                     QString::at((QString *)in_stack_ffffffffffffc808,
                                 (qsizetype)in_stack_ffffffffffffc800);
        QChar::QChar<char,_true>(&local_1134,'$');
        bVar1 = ::operator==((QChar *)in_stack_ffffffffffffc800,(QChar *)in_stack_ffffffffffffc7f8);
        local_3441 = false;
        if (bVar1) {
          local_1136 = (char16_t)
                       QString::at((QString *)in_stack_ffffffffffffc808,
                                   (qsizetype)in_stack_ffffffffffffc800);
          QChar::QChar<char,_true>(&local_1138,'(');
          local_3441 = ::operator!=((QChar *)in_stack_ffffffffffffc800,
                                    (QChar *)in_stack_ffffffffffffc7f8);
        }
      }
      if (local_3441 == false) {
        QChar::QChar<char,_true>(local_1152,'@');
        uVar7 = QString::startsWith((QChar)(char16_t)local_1130,(uint)(ushort)local_1152[0].ucs);
        local_3442 = 0;
        if ((uVar7 & 1) == 0) {
          QString::QString((QString *)in_stack_ffffffffffffc800,(QString *)in_stack_ffffffffffffc7f8
                          );
          MakefileGenerator::fileInfo
                    (in_stack_ffffffffffffc830,(QString *)in_stack_ffffffffffffc828);
          local_3442 = QFileInfo::isRelative();
          QFileInfo::~QFileInfo(local_1160);
          QString::~QString((QString *)0x1ed581);
        }
        if ((local_3442 & 1) == 0) goto LAB_001ed8ca;
        local_1190 = 0xaaaaaaaaaaaaaaaa;
        local_1188 = 0xaaaaaaaaaaaaaaaa;
        local_1180 = 0xaaaaaaaaaaaaaaaa;
        ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
        QMakeEvaluator::first
                  (&in_stack_ffffffffffffc818->super_QMakeEvaluator,
                   (ProKey *)in_stack_ffffffffffffc810);
        ProString::toQString((ProString *)in_stack_ffffffffffffc7f8);
        ProString::~ProString((ProString *)0x1ed628);
        ProKey::~ProKey((ProKey *)0x1ed635);
        bVar1 = QString::isEmpty((QString *)0x1ed642);
        __stream = _stderr;
        if (bVar1) {
          QString::toLatin1((QString *)in_stack_ffffffffffffc7f8);
          pcVar9 = QByteArray::constData((QByteArray *)0x1ed67c);
          fprintf(__stream,
                  "Error: This platform does not support relative paths in QMAKE_RPATHDIR (%s)\n",
                  pcVar9);
          QByteArray::~QByteArray((QByteArray *)0x1ed6a2);
          local_3004 = 9;
        }
        else {
          QChar::QChar<char,_true>(local_120a,'$');
          uVar12 = QString::startsWith((QChar)(char16_t)&local_1190,(uint)(ushort)local_120a[0].ucs)
          ;
          if ((uVar12 & 1) != 0) {
            QString::QString((QString *)in_stack_ffffffffffffc808,(char *)in_stack_ffffffffffffc838)
            ;
            QString::replace((longlong)&local_1190,0,(QString *)0x1);
            QString::~QString((QString *)0x1ed723);
          }
          local_1230 = ".";
          bVar1 = ::operator==((QString *)in_stack_ffffffffffffc800,
                               (char **)in_stack_ffffffffffffc7f8);
          if (bVar1) {
            QString::operator=(local_1130,(QString *)&local_1190);
          }
          else {
            local_1249 = 0x2f;
            QVar14 = ::operator+((QString *)in_stack_ffffffffffffc808,
                                 (char *)in_stack_ffffffffffffc800);
            local_1260 = QVar14.a;
            local_1258 = QVar14.b;
            local_18 = local_1260;
            local_10 = local_1258;
            ::QStringBuilder::operator_cast_to_QString
                      ((QStringBuilder<QString_&,_char> *)in_stack_ffffffffffffc7f8);
            QString::prepend((QString *)in_stack_ffffffffffffc800,
                             (QString *)in_stack_ffffffffffffc7f8);
            QString::~QString((QString *)0x1ed7e8);
          }
          ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
          QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
          ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
          QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
          ProStringList::insertUnique
                    ((ProStringList *)in_stack_ffffffffffffc810,
                     (ProStringList *)in_stack_ffffffffffffc808);
          ProKey::~ProKey((ProKey *)0x1ed890);
          ProKey::~ProKey((ProKey *)0x1ed89d);
          local_3004 = 0;
        }
        QString::~QString((QString *)0x1ed8b5);
        if (local_3004 == 0) goto LAB_001ed8ca;
      }
      else {
        QString::QString((QString *)in_stack_ffffffffffffc808,(char *)in_stack_ffffffffffffc838);
        QString::replace((longlong)local_1130,0,(QString *)0x1);
        QString::~QString((QString *)0x1ed49a);
LAB_001ed8ca:
        ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
        (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x16])
                  (local_1338,this,local_1368);
        (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc])
                  (local_1380,this,local_1130);
        ::operator+((QString *)in_stack_ffffffffffffc808,(QString *)in_stack_ffffffffffffc800);
        ProString::ProString<QString,QString>
                  ((ProString *)in_stack_ffffffffffffc810,
                   (QStringBuilder<QString,_QString> *)in_stack_ffffffffffffc808);
        ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
        QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
        QList<ProString>::operator+=
                  ((QList<ProString> *)in_stack_ffffffffffffc800,
                   (rvalue_ref)in_stack_ffffffffffffc7f8);
        ProKey::~ProKey((ProKey *)0x1ed9ac);
        ProString::~ProString((ProString *)0x1ed9b9);
        QStringBuilder<QString,_QString>::~QStringBuilder
                  ((QStringBuilder<QString,_QString> *)in_stack_ffffffffffffc800);
        QString::~QString((QString *)0x1ed9d3);
        QString::~QString((QString *)0x1ed9e0);
        ProKey::~ProKey((ProKey *)0x1ed9ed);
      }
      QString::~QString((QString *)0x1eda05);
    }
  }
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
  bVar1 = QMakeProject::isEmpty(in_stack_ffffffffffffc818,(ProKey *)in_stack_ffffffffffffc810);
  ProKey::~ProKey((ProKey *)0x1eda84);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
    pQVar10 = &QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8)->
               super_QList<ProString>;
    ProKey::~ProKey((ProKey *)0x1edafb);
    for (local_3054 = 0; qVar11 = QList<ProString>::size(pQVar10), local_3054 < qVar11;
        local_3054 = local_3054 + 1) {
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
      bVar1 = QMakeProject::isEmpty(in_stack_ffffffffffffc818,(ProKey *)in_stack_ffffffffffffc810);
      ProKey::~ProKey((ProKey *)0x1edb9d);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
        (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x16])
                  (local_14b8,this,local_14e8);
        QList<ProString>::operator[]
                  ((QList<ProString> *)in_stack_ffffffffffffc800,
                   (qsizetype)in_stack_ffffffffffffc7f8);
        ProString::toQString((ProString *)in_stack_ffffffffffffc7f8);
        QFileInfo::QFileInfo(local_1520,(QString *)local_1538);
        QFileInfo::absoluteFilePath();
        (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc])
                  (local_1500,this,local_1518);
        ::operator+((QString *)in_stack_ffffffffffffc808,(QString *)in_stack_ffffffffffffc800);
        ProString::ProString<QString,QString>
                  ((ProString *)in_stack_ffffffffffffc810,
                   (QStringBuilder<QString,_QString> *)in_stack_ffffffffffffc808);
        ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
        QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
        QList<ProString>::operator+=
                  ((QList<ProString> *)in_stack_ffffffffffffc800,
                   (rvalue_ref)in_stack_ffffffffffffc7f8);
        ProKey::~ProKey((ProKey *)0x1edcde);
        ProString::~ProString((ProString *)0x1edceb);
        QStringBuilder<QString,_QString>::~QStringBuilder
                  ((QStringBuilder<QString,_QString> *)in_stack_ffffffffffffc800);
        QString::~QString((QString *)0x1edd05);
        QString::~QString((QString *)0x1edd12);
        QFileInfo::~QFileInfo(local_1520);
        QString::~QString((QString *)0x1edd2c);
        QString::~QString((QString *)0x1edd39);
        ProKey::~ProKey((ProKey *)0x1edd46);
      }
    }
  }
  QString::QString((QString *)in_stack_ffffffffffffc808,(char *)in_stack_ffffffffffffc838);
  pEVar13 = local_1580;
  bVar1 = QMakeProject::isActiveConfig
                    (in_stack_ffffffffffffc808,(QString *)in_stack_ffffffffffffc800,
                     SUB81((ulong)in_stack_ffffffffffffc7f8 >> 0x38,0));
  local_34b9 = 0;
  if (bVar1) {
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
    pEVar13 = local_15b0;
    bVar1 = QMakeProject::isEmpty(in_stack_ffffffffffffc818,(ProKey *)in_stack_ffffffffffffc810);
    local_34b9 = bVar1 ^ 0xff;
    ProKey::~ProKey((ProKey *)0x1ede34);
  }
  QString::~QString((QString *)0x1ede41);
  if ((local_34b9 & 1) != 0) {
    this->include_deps = true;
  }
  MakefileGenerator::init(&this->super_MakefileGenerator,pEVar13);
  QString::QString((QString *)in_stack_ffffffffffffc808,(char *)in_stack_ffffffffffffc838);
  bVar1 = QMakeProject::isActiveConfig
                    (in_stack_ffffffffffffc808,(QString *)in_stack_ffffffffffffc800,
                     SUB81((ulong)in_stack_ffffffffffffc7f8 >> 0x38,0));
  QString::~QString((QString *)0x1edec0);
  if (bVar1) {
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
    QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
    ProString::ProString((ProString *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc818);
    ProStringList::operator<<
              ((ProStringList *)in_stack_ffffffffffffc800,(ProString *)in_stack_ffffffffffffc7f8);
    ProString::ProString((ProString *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc818);
    ProStringList::operator<<
              ((ProStringList *)in_stack_ffffffffffffc800,(ProString *)in_stack_ffffffffffffc7f8);
    ProString::~ProString((ProString *)0x1edf7f);
    ProString::~ProString((ProString *)0x1edf8c);
    ProKey::~ProKey((ProKey *)0x1edf99);
  }
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
  QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
  ProKey::~ProKey((ProKey *)0x1ee000);
  local_1690[0].i = (ProString *)0xaaaaaaaaaaaaaaaa;
  local_1690[0] = QList<ProString>::begin((QList<ProString> *)in_stack_ffffffffffffc800);
  local_1698.i = (ProString *)0xaaaaaaaaaaaaaaaa;
  local_1698 = QList<ProString>::end((QList<ProString> *)in_stack_ffffffffffffc800);
  while( true ) {
    local_16a0 = local_1698.i;
    bVar1 = QList<ProString>::iterator::operator!=(local_1690,local_1698);
    if (!bVar1) break;
    QList<ProString>::iterator::operator*(local_1690);
    local_16b8 = 0xaaaaaaaaaaaaaaaa;
    local_16b0 = 0xaaaaaaaaaaaaaaaa;
    local_16a8 = 0xaaaaaaaaaaaaaaaa;
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
    (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x16])
              (&local_16b8,this,local_16e8);
    ProKey::~ProKey((ProKey *)0x1ee11c);
    bVar1 = QString::isEmpty((QString *)0x1ee129);
    if (bVar1) {
      QString::operator=((QString *)in_stack_ffffffffffffc808,(char *)in_stack_ffffffffffffc828);
    }
    uVar7 = (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo
              [0x21])();
    local_3509 = 0;
    if ((uVar7 & 1) != 0) {
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
      bVar1 = QMakeProject::isEmpty(in_stack_ffffffffffffc818,(ProKey *)in_stack_ffffffffffffc810);
      local_3509 = bVar1 ^ 0xff;
      ProKey::~ProKey((ProKey *)0x1ee1e6);
    }
    if ((local_3509 & 1) != 0) {
      local_1730 = 0xaaaaaaaaaaaaaaaa;
      local_1728 = 0xaaaaaaaaaaaaaaaa;
      local_1720 = 0xaaaaaaaaaaaaaaaa;
      local_1788 = ::operator+((char (*) [7])in_stack_ffffffffffffc800,
                               (ProString *)in_stack_ffffffffffffc7f8);
      ::operator+((QStringBuilder<const_char_(&)[7],_const_ProString_&> *)in_stack_ffffffffffffc800,
                  (char (*) [21])in_stack_ffffffffffffc7f8);
      ProKey::ProKey<QStringBuilder<char_const(&)[7],ProString_const&>,char_const(&)[21]>
                ((ProKey *)in_stack_ffffffffffffc800,
                 (QStringBuilder<QStringBuilder<const_char_(&)[7],_const_ProString_&>,_const_char_(&)[21]>
                  *)in_stack_ffffffffffffc7f8);
      (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x16])
                (&local_1730,this,local_1760);
      ProKey::~ProKey((ProKey *)0x1ee2a6);
      local_17a0 = 0xaaaaaaaaaaaaaaaa;
      local_1798 = 0xaaaaaaaaaaaaaaaa;
      local_1790 = 0xaaaaaaaaaaaaaaaa;
      QString::QString((QString *)0x1ee2e0);
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
      bVar1 = QMakeProject::isEmpty(in_stack_ffffffffffffc818,(ProKey *)in_stack_ffffffffffffc810);
      ProKey::~ProKey((ProKey *)0x1ee336);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
        QMakeEvaluator::first
                  (&in_stack_ffffffffffffc818->super_QMakeEvaluator,
                   (ProKey *)in_stack_ffffffffffffc810);
        ProString::toQString((ProString *)in_stack_ffffffffffffc7f8);
        Option::fixPathToTargetOS
                  ((QString *)in_stack_ffffffffffffc818,
                   SUB81((ulong)in_stack_ffffffffffffc810 >> 0x38,0),
                   SUB81((ulong)in_stack_ffffffffffffc810 >> 0x30,0));
        QString::operator=((QString *)in_stack_ffffffffffffc800,(QString *)in_stack_ffffffffffffc7f8
                          );
        QString::~QString((QString *)0x1ee3e1);
        QString::~QString((QString *)0x1ee3ee);
        ProString::~ProString((ProString *)0x1ee3fb);
        ProKey::~ProKey((ProKey *)0x1ee408);
        uVar12 = QString::endsWith((QString *)&local_17a0,0x3bdbd8);
        if ((uVar12 & 1) == 0) {
          QString::operator+=((QString *)in_stack_ffffffffffffc800,
                              (QString *)in_stack_ffffffffffffc7f8);
        }
      }
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
      QMakeEvaluator::first
                (&in_stack_ffffffffffffc818->super_QMakeEvaluator,
                 (ProKey *)in_stack_ffffffffffffc810);
      ProString::toQString((ProString *)in_stack_ffffffffffffc7f8);
      QString::operator+=((QString *)in_stack_ffffffffffffc800,(QString *)in_stack_ffffffffffffc7f8)
      ;
      QString::~QString((QString *)0x1ee4ba);
      ProString::~ProString((ProString *)0x1ee4c7);
      ProKey::~ProKey((ProKey *)0x1ee4d4);
      QLatin1String::QLatin1String
                ((QLatin1String *)in_stack_ffffffffffffc810,(char *)in_stack_ffffffffffffc808);
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
      QMakeEvaluator::first
                (&in_stack_ffffffffffffc818->super_QMakeEvaluator,
                 (ProKey *)in_stack_ffffffffffffc810);
      ProString::toQString((ProString *)in_stack_ffffffffffffc7f8);
      (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc])
                (local_1900,this,local_1918);
      QString::replace((QLatin1String *)&local_1730,local_18e8,(CaseSensitivity)local_18e0);
      QString::~QString((QString *)0x1ee59b);
      QString::~QString((QString *)0x1ee5a8);
      ProString::~ProString((ProString *)0x1ee5b5);
      ProKey::~ProKey((ProKey *)0x1ee5c2);
      QLatin1String::QLatin1String
                ((QLatin1String *)in_stack_ffffffffffffc810,(char *)in_stack_ffffffffffffc808);
      (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc])
                (local_19a0,this,&local_17a0);
      QString::replace((QLatin1String *)&local_1730,local_1988,(CaseSensitivity)local_1980);
      QString::~QString((QString *)0x1ee62c);
      QString::QString((QString *)in_stack_ffffffffffffc808,(char *)in_stack_ffffffffffffc838);
      bVar1 = QMakeProject::isActiveConfig
                        (in_stack_ffffffffffffc808,(QString *)in_stack_ffffffffffffc800,
                         SUB81((ulong)in_stack_ffffffffffffc7f8 >> 0x38,0));
      QString::~QString((QString *)0x1ee682);
      if (bVar1) {
        QLatin1String::QLatin1String
                  ((QLatin1String *)in_stack_ffffffffffffc810,(char *)in_stack_ffffffffffffc808);
        ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
        QMakeEvaluator::first
                  (&in_stack_ffffffffffffc818->super_QMakeEvaluator,
                   (ProKey *)in_stack_ffffffffffffc810);
        ::operator+((QString *)in_stack_ffffffffffffc808,(ProString *)in_stack_ffffffffffffc800);
        MakefileGenerator::escapeFilePath<QString&,ProString>
                  ((MakefileGenerator *)in_stack_ffffffffffffc818,
                   (QStringBuilder<QString_&,_ProString> *)in_stack_ffffffffffffc810);
        QString::replace((QLatin1String *)&local_1730,local_19c8,(CaseSensitivity)local_19c0);
        QString::~QString((QString *)0x1ee760);
        QStringBuilder<QString_&,_ProString>::~QStringBuilder
                  ((QStringBuilder<QString_&,_ProString> *)0x1ee76d);
        ProString::~ProString((ProString *)0x1ee77a);
        ProKey::~ProKey((ProKey *)0x1ee787);
        local_1a90 = 0xaaaaaaaaaaaaaaaa;
        local_1a88 = 0xaaaaaaaaaaaaaaaa;
        local_1a80 = 0xaaaaaaaaaaaaaaaa;
        ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
        QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
        ProStringList::ProStringList
                  ((ProStringList *)in_stack_ffffffffffffc800,
                   (ProStringList *)in_stack_ffffffffffffc7f8);
        ProKey::~ProKey((ProKey *)0x1ee811);
        local_1ac8[0].i = (ProString *)0xaaaaaaaaaaaaaaaa;
        local_1ac8[0] = QList<ProString>::begin((QList<ProString> *)in_stack_ffffffffffffc800);
        local_1ad0.i = (ProString *)0xaaaaaaaaaaaaaaaa;
        local_1ad0 = QList<ProString>::end((QList<ProString> *)in_stack_ffffffffffffc800);
        while( true ) {
          local_1ad8 = local_1ad0.i;
          bVar1 = QList<ProString>::const_iterator::operator!=(local_1ac8,local_1ad0);
          if (!bVar1) break;
          QList<ProString>::const_iterator::operator*(local_1ac8);
          local_1af0 = 0xaaaaaaaaaaaaaaaa;
          local_1ae8 = 0xaaaaaaaaaaaaaaaa;
          local_1ae0 = 0xaaaaaaaaaaaaaaaa;
          ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
          QMakeEvaluator::first
                    (&in_stack_ffffffffffffc818->super_QMakeEvaluator,
                     (ProKey *)in_stack_ffffffffffffc810);
          ProString::toQString((ProString *)in_stack_ffffffffffffc7f8);
          ProString::~ProString((ProString *)0x1ee96a);
          ProKey::~ProKey((ProKey *)0x1ee977);
          QLatin1String::QLatin1String
                    ((QLatin1String *)in_stack_ffffffffffffc810,(char *)in_stack_ffffffffffffc808);
          ProString::toQString((ProString *)in_stack_ffffffffffffc7f8);
          QString::replace((QLatin1String *)&local_1af0,local_1b60,(CaseSensitivity)local_1b58);
          QString::~QString((QString *)0x1ee9d8);
          QLatin1String::QLatin1String
                    ((QLatin1String *)in_stack_ffffffffffffc810,(char *)in_stack_ffffffffffffc808);
          ::operator+((QLatin1String *)in_stack_ffffffffffffc800,
                      (ProString *)in_stack_ffffffffffffc7f8);
          QLatin1Char::QLatin1Char(local_1bb9,'}');
          ::operator+((QStringBuilder<QLatin1String,_const_ProString_&> *)in_stack_ffffffffffffc800,
                      (QLatin1Char *)in_stack_ffffffffffffc7f8);
          ::QStringBuilder::operator_cast_to_QString
                    ((QStringBuilder<QStringBuilder<QLatin1String,_const_ProString_&>,_QLatin1Char>
                      *)in_stack_ffffffffffffc7f8);
          local_1be8 = ::operator+((QString *)in_stack_ffffffffffffc800,
                                   (QString *)in_stack_ffffffffffffc7f8);
          MakefileGenerator::escapeFilePath<QString&,QString&>
                    ((MakefileGenerator *)in_stack_ffffffffffffc818,
                     (QStringBuilder<QString_&,_QString_&> *)in_stack_ffffffffffffc810);
          QString::replace((QString *)&local_1730,(QString *)local_1b90,(CaseSensitivity)local_1bd8)
          ;
          QString::~QString((QString *)0x1eeabe);
          QString::~QString((QString *)0x1eeacb);
          QString::~QString((QString *)0x1eead8);
          QList<ProString>::const_iterator::operator++(local_1ac8);
        }
        ProStringList::~ProStringList((ProStringList *)0x1eeaf7);
      }
      else {
        local_1c00 = 0xaaaaaaaaaaaaaaaa;
        local_1bf8 = 0xaaaaaaaaaaaaaaaa;
        local_1bf0 = 0xaaaaaaaaaaaaaaaa;
        QString::QString((QString *)0x1eeb36);
        QString::QString((QString *)in_stack_ffffffffffffc808,(char *)in_stack_ffffffffffffc838);
        bVar1 = QMakeProject::isActiveConfig
                          (in_stack_ffffffffffffc808,(QString *)in_stack_ffffffffffffc800,
                           SUB81((ulong)in_stack_ffffffffffffc7f8 >> 0x38,0));
        QString::~QString((QString *)0x1eeb8c);
        if (bVar1) {
          ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
          QMakeEvaluator::first
                    (&in_stack_ffffffffffffc818->super_QMakeEvaluator,
                     (ProKey *)in_stack_ffffffffffffc810);
          ProString::toQString((ProString *)in_stack_ffffffffffffc7f8);
          QString::operator=((QString *)in_stack_ffffffffffffc800,
                             (QString *)in_stack_ffffffffffffc7f8);
          QString::~QString((QString *)0x1eec1b);
          ProString::~ProString((ProString *)0x1eec28);
          ProKey::~ProKey((ProKey *)0x1eec35);
        }
        ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
        QMakeEvaluator::first
                  (&in_stack_ffffffffffffc818->super_QMakeEvaluator,
                   (ProKey *)in_stack_ffffffffffffc810);
        ProString::toQString((ProString *)in_stack_ffffffffffffc7f8);
        QString::operator+=((QString *)in_stack_ffffffffffffc800,
                            (QString *)in_stack_ffffffffffffc7f8);
        QString::~QString((QString *)0x1eecb4);
        ProString::~ProString((ProString *)0x1eecc1);
        ProKey::~ProKey((ProKey *)0x1eecce);
        QString::operator+=((QString *)in_stack_ffffffffffffc800,
                            (QString *)in_stack_ffffffffffffc7f8);
        memset(local_1d38,0xaa,0x30);
        local_1d78 = ::operator+((char (*) [16])in_stack_ffffffffffffc800,
                                 (ProString *)in_stack_ffffffffffffc7f8);
        ProKey::ProKey<char_const(&)[16],ProString_const&>
                  ((ProKey *)in_stack_ffffffffffffc800,
                   (QStringBuilder<const_char_(&)[16],_const_ProString_&> *)
                   in_stack_ffffffffffffc7f8);
        QMakeEvaluator::first
                  (&in_stack_ffffffffffffc818->super_QMakeEvaluator,
                   (ProKey *)in_stack_ffffffffffffc810);
        ProKey::~ProKey((ProKey *)0x1eed73);
        bVar1 = ProString::isEmpty(local_1d38);
        if (!bVar1) {
          QLatin1String::QLatin1String
                    ((QLatin1String *)in_stack_ffffffffffffc810,(char *)in_stack_ffffffffffffc808);
          local_1dc8 = ::operator+((QString *)in_stack_ffffffffffffc800,
                                   (ProString *)in_stack_ffffffffffffc7f8);
          ::operator+((QStringBuilder<QString_&,_ProString_&> *)in_stack_ffffffffffffc800,
                      (QString *)in_stack_ffffffffffffc7f8);
          MakefileGenerator::escapeFilePath<QStringBuilder<QString&,ProString&>,QString&>
                    ((MakefileGenerator *)in_stack_ffffffffffffc818,
                     (QStringBuilder<QStringBuilder<QString_&,_ProString_&>,_QString_&> *)
                     in_stack_ffffffffffffc810);
          QString::replace((QLatin1String *)&local_1730,local_1d88,(CaseSensitivity)local_1d80);
          QString::~QString((QString *)0x1eee33);
          local_1de0 = 0xaaaaaaaaaaaaaaaa;
          local_1dd8 = 0xaaaaaaaaaaaaaaaa;
          local_1dd0 = 0xaaaaaaaaaaaaaaaa;
          ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
          QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
          ProStringList::ProStringList
                    ((ProStringList *)in_stack_ffffffffffffc800,
                     (ProStringList *)in_stack_ffffffffffffc7f8);
          ProKey::~ProKey((ProKey *)0x1eeebd);
          local_1e18[0].i = (ProString *)0xaaaaaaaaaaaaaaaa;
          local_1e18[0] = QList<ProString>::begin((QList<ProString> *)in_stack_ffffffffffffc800);
          local_1e20.i = (ProString *)0xaaaaaaaaaaaaaaaa;
          local_1e20 = QList<ProString>::end((QList<ProString> *)in_stack_ffffffffffffc800);
          while( true ) {
            local_1e28 = local_1e20.i;
            bVar1 = QList<ProString>::const_iterator::operator!=(local_1e18,local_1e20);
            if (!bVar1) break;
            QList<ProString>::const_iterator::operator*(local_1e18);
            local_1e40 = 0xaaaaaaaaaaaaaaaa;
            local_1e38 = 0xaaaaaaaaaaaaaaaa;
            local_1e30 = 0xaaaaaaaaaaaaaaaa;
            local_1e68 = ::operator+((QString *)in_stack_ffffffffffffc800,
                                     (ProString *)in_stack_ffffffffffffc7f8);
            ::operator+((QStringBuilder<QString_&,_ProString_&> *)in_stack_ffffffffffffc800,
                        (QString *)in_stack_ffffffffffffc7f8);
            ::QStringBuilder::operator_cast_to_QString
                      ((QStringBuilder<QStringBuilder<QString_&,_ProString_&>,_QString_&> *)
                       in_stack_ffffffffffffc7f8);
            QLatin1String::QLatin1String
                      ((QLatin1String *)in_stack_ffffffffffffc810,(char *)in_stack_ffffffffffffc808)
            ;
            ProString::toQString((ProString *)in_stack_ffffffffffffc7f8);
            QString::replace((QLatin1String *)&local_1e40,local_1e78,(CaseSensitivity)local_1e70);
            QString::~QString((QString *)0x1ef061);
            QString::QString((QString *)in_stack_ffffffffffffc808,(char *)in_stack_ffffffffffffc838)
            ;
            bVar1 = QMakeProject::isActiveConfig
                              (in_stack_ffffffffffffc808,(QString *)in_stack_ffffffffffffc800,
                               SUB81((ulong)in_stack_ffffffffffffc7f8 >> 0x38,0));
            local_3599 = 0;
            if (bVar1) {
              QLatin1String::QLatin1String
                        ((QLatin1String *)in_stack_ffffffffffffc810,
                         (char *)in_stack_ffffffffffffc808);
              bVar6 = QString::endsWith((QLatin1String *)&local_1e40,
                                        (CaseSensitivity)local_1ee0._40_8_);
              local_35a9 = 1;
              if ((bVar6 & 1) == 0) {
                QLatin1String::QLatin1String
                          ((QLatin1String *)in_stack_ffffffffffffc810,
                           (char *)in_stack_ffffffffffffc808);
                local_35a9 = QString::endsWith((QLatin1String *)&local_1e40,
                                               (CaseSensitivity)local_1ee0._24_8_);
              }
              local_3599 = local_35a9;
            }
            QString::~QString((QString *)0x1ef164);
            if ((local_3599 & 1) != 0) {
              QString::chop((longlong)&local_1e40);
            }
            QLatin1String::QLatin1String
                      ((QLatin1String *)in_stack_ffffffffffffc810,(char *)in_stack_ffffffffffffc808)
            ;
            ::operator+((QLatin1String *)in_stack_ffffffffffffc800,
                        (ProString *)in_stack_ffffffffffffc7f8);
            QLatin1Char::QLatin1Char(local_1f09,'}');
            ::operator+((QStringBuilder<QLatin1String,_const_ProString_&> *)
                        in_stack_ffffffffffffc800,(QLatin1Char *)in_stack_ffffffffffffc7f8);
            ::QStringBuilder::operator_cast_to_QString
                      ((QStringBuilder<QStringBuilder<QLatin1String,_const_ProString_&>,_QLatin1Char>
                        *)in_stack_ffffffffffffc7f8);
            (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo
              [0xc])(local_1f28,this,&local_1e40);
            QString::replace((QString *)&local_1730,(QString *)local_1ee0,
                             (CaseSensitivity)local_1f28);
            QString::~QString((QString *)0x1ef245);
            QString::~QString((QString *)0x1ef252);
            QString::~QString((QString *)0x1ef25f);
            QList<ProString>::const_iterator::operator++(local_1e18);
          }
          ProStringList::~ProStringList((ProStringList *)0x1ef27e);
        }
        ProString::~ProString((ProString *)0x1ef28b);
        QString::~QString((QString *)0x1ef298);
      }
      bVar1 = QString::isEmpty((QString *)0x1ef2a5);
      if (!bVar1) {
        local_1f38 = ::operator+((char (*) [2])in_stack_ffffffffffffc800,
                                 (QString *)in_stack_ffffffffffffc7f8);
        ::operator+=((QString *)in_stack_ffffffffffffc830,in_stack_ffffffffffffc828);
      }
      QString::~QString((QString *)0x1ef2ef);
      QString::~QString((QString *)0x1ef2fc);
    }
    local_1f50 = 0xaaaaaaaaaaaaaaaa;
    local_1f48 = 0xaaaaaaaaaaaaaaaa;
    local_1f40 = 0xaaaaaaaaaaaaaaaa;
    QString::QString((QString *)0x1ef336);
    bVar1 = ProString::operator==
                      ((ProString *)in_stack_ffffffffffffc820,(char *)in_stack_ffffffffffffc818);
    if ((bVar1) ||
       (bVar1 = ProString::operator==
                          ((ProString *)in_stack_ffffffffffffc820,(char *)in_stack_ffffffffffffc818)
       , bVar1)) {
      QString::operator=((QString *)in_stack_ffffffffffffc808,(char *)in_stack_ffffffffffffc828);
      QString::operator+=((QString *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc818);
    }
    else {
      QString::operator=((QString *)in_stack_ffffffffffffc808,(char *)in_stack_ffffffffffffc828);
      QString::operator+=((QString *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc818);
    }
    QString::operator+=((QString *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc818);
    memset(local_1f80,0xaa,0x30);
    ProString::ProString
              ((ProString *)in_stack_ffffffffffffc800,(ProString *)in_stack_ffffffffffffc7f8);
    bVar1 = ProString::operator==
                      ((ProString *)in_stack_ffffffffffffc820,(char *)in_stack_ffffffffffffc818);
    if (bVar1) {
      ProString::ProString((ProString *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc818)
      ;
      ProString::operator=
                ((ProString *)in_stack_ffffffffffffc800,(ProString *)in_stack_ffffffffffffc7f8);
      ProString::~ProString((ProString *)0x1ef44a);
    }
    memset(local_1fe0,0xaa,0x30);
    local_1ff0 = ::operator+((char (*) [11])in_stack_ffffffffffffc800,
                             (ProString *)in_stack_ffffffffffffc7f8);
    ProKey::ProKey<char_const(&)[11],ProString&>
              ((ProKey *)in_stack_ffffffffffffc800,
               (QStringBuilder<const_char_(&)[11],_ProString_&> *)in_stack_ffffffffffffc7f8);
    bVar1 = QMakeProject::isEmpty(in_stack_ffffffffffffc818,(ProKey *)in_stack_ffffffffffffc810);
    if (bVar1) {
      QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
      local_20e0 = ::operator+((QString *)in_stack_ffffffffffffc800,
                               (char (*) [2])in_stack_ffffffffffffc7f8);
      ::operator+((QStringBuilder<QString_&,_const_char_(&)[2]> *)in_stack_ffffffffffffc800,
                  (QString *)in_stack_ffffffffffffc7f8);
      ::operator+((QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&> *)
                  in_stack_ffffffffffffc800,(char (*) [2])in_stack_ffffffffffffc7f8);
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
      (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x16])
                (local_20f8,this,local_2128);
      ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>,_const_char_(&)[2]>
                   *)in_stack_ffffffffffffc808,(QString *)in_stack_ffffffffffffc800);
      ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>,_const_char_(&)[2]>,_QString>
                   *)in_stack_ffffffffffffc808,(char (*) [10])in_stack_ffffffffffffc800);
      ProString::
      ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString&,char_const(&)[2]>,QString&>,char_const(&)[2]>,QString>,char_const(&)[10]>
                ((ProString *)in_stack_ffffffffffffc810,
                 (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>,_const_char_(&)[2]>,_QString>,_const_char_(&)[10]>
                  *)in_stack_ffffffffffffc808);
      QList<ProString>::append
                ((QList<ProString> *)in_stack_ffffffffffffc800,(rvalue_ref)in_stack_ffffffffffffc7f8
                );
      ProString::~ProString((ProString *)0x1ef5e5);
      QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>,_const_char_(&)[2]>,_QString>,_const_char_(&)[10]>
      ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>,_const_char_(&)[2]>,_QString>,_const_char_(&)[10]>
                         *)0x1ef5f2);
      QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>,_const_char_(&)[2]>,_QString>
      ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>,_const_char_(&)[2]>,_QString>
                         *)0x1ef5ff);
      QString::~QString((QString *)0x1ef60c);
      ProKey::~ProKey((ProKey *)0x1ef619);
    }
    memset(local_2158,0xaa,0x30);
    local_2180 = ::operator+((char (*) [11])in_stack_ffffffffffffc800,
                             (ProString *)in_stack_ffffffffffffc7f8);
    ::operator+((QStringBuilder<const_char_(&)[11],_ProString_&> *)in_stack_ffffffffffffc800,
                (char (*) [5])in_stack_ffffffffffffc7f8);
    ProKey::ProKey<QStringBuilder<char_const(&)[11],ProString&>,char_const(&)[5]>
              ((ProKey *)in_stack_ffffffffffffc800,
               (QStringBuilder<QStringBuilder<const_char_(&)[11],_ProString_&>,_const_char_(&)[5]> *
               )in_stack_ffffffffffffc7f8);
    bVar1 = QMakeProject::isEmpty(in_stack_ffffffffffffc818,(ProKey *)in_stack_ffffffffffffc810);
    if (bVar1) {
      QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
      local_2270 = ::operator+((QString *)in_stack_ffffffffffffc800,
                               (char (*) [2])in_stack_ffffffffffffc7f8);
      ::operator+((QStringBuilder<QString_&,_const_char_(&)[2]> *)in_stack_ffffffffffffc800,
                  (QString *)in_stack_ffffffffffffc7f8);
      ::operator+((QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&> *)
                  in_stack_ffffffffffffc800,(char (*) [2])in_stack_ffffffffffffc7f8);
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
      (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x16])
                (local_2288,this,local_22b8);
      ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>,_const_char_(&)[2]>
                   *)in_stack_ffffffffffffc808,(QString *)in_stack_ffffffffffffc800);
      ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>,_const_char_(&)[2]>,_QString>
                   *)in_stack_ffffffffffffc808,(char (*) [10])in_stack_ffffffffffffc800);
      ProString::
      ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString&,char_const(&)[2]>,QString&>,char_const(&)[2]>,QString>,char_const(&)[10]>
                ((ProString *)in_stack_ffffffffffffc810,
                 (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>,_const_char_(&)[2]>,_QString>,_const_char_(&)[10]>
                  *)in_stack_ffffffffffffc808);
      QList<ProString>::append
                ((QList<ProString> *)in_stack_ffffffffffffc800,(rvalue_ref)in_stack_ffffffffffffc7f8
                );
      ProString::~ProString((ProString *)0x1ef7d0);
      QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>,_const_char_(&)[2]>,_QString>,_const_char_(&)[10]>
      ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>,_const_char_(&)[2]>,_QString>,_const_char_(&)[10]>
                         *)0x1ef7dd);
      QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>,_const_char_(&)[2]>,_QString>
      ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>,_const_char_(&)[2]>,_QString>
                         *)0x1ef7ea);
      QString::~QString((QString *)0x1ef7f7);
      ProKey::~ProKey((ProKey *)0x1ef804);
    }
    ProKey::~ProKey((ProKey *)0x1ef811);
    ProKey::~ProKey((ProKey *)0x1ef81e);
    ProString::~ProString((ProString *)0x1ef82b);
    QString::~QString((QString *)0x1ef838);
    QString::~QString((QString *)0x1ef845);
    QList<ProString>::iterator::operator++(local_1690);
  }
  QString::QString((QString *)in_stack_ffffffffffffc808,(char *)in_stack_ffffffffffffc838);
  cs = (CaseSensitivity)((ulong)in_stack_ffffffffffffc828 >> 0x20);
  bVar4 = QMakeProject::isActiveConfig
                    (in_stack_ffffffffffffc808,(QString *)in_stack_ffffffffffffc800,
                     SUB81((ulong)in_stack_ffffffffffffc7f8 >> 0x38,0));
  bVar2 = false;
  bVar3 = false;
  bVar1 = false;
  local_35c1 = false;
  if (bVar4) {
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
    bVar2 = true;
    bVar4 = QMakeProject::isEmpty(in_stack_ffffffffffffc818,(ProKey *)in_stack_ffffffffffffc810);
    local_35c1 = false;
    if (!bVar4) {
      QString::QString((QString *)in_stack_ffffffffffffc808,(char *)in_stack_ffffffffffffc838);
      bVar3 = true;
      bVar1 = QMakeProject::isActiveConfig
                        (in_stack_ffffffffffffc808,(QString *)in_stack_ffffffffffffc800,
                         SUB81((ulong)in_stack_ffffffffffffc7f8 >> 0x38,0));
      local_35d9 = true;
      bVar1 = !bVar1;
      if (bVar1) {
        ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
        local_35d9 = QMakeProject::isEmpty
                               (in_stack_ffffffffffffc818,(ProKey *)in_stack_ffffffffffffc810);
      }
      local_35c1 = local_35d9;
    }
  }
  if (bVar1) {
    ProKey::~ProKey((ProKey *)0x1efa00);
  }
  if (bVar3) {
    QString::~QString((QString *)0x1efa19);
  }
  if (bVar2) {
    ProKey::~ProKey((ProKey *)0x1efa32);
  }
  QString::~QString((QString *)0x1efa3f);
  if (local_35c1 == false) {
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
    QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
    QList<ProString>::clear((QList<ProString> *)in_stack_ffffffffffffc800);
    ProKey::~ProKey((ProKey *)0x1f0e88);
    in_stack_ffffffffffffc810 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
    QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
    QList<ProString>::clear((QList<ProString> *)in_stack_ffffffffffffc800);
    ProKey::~ProKey((ProKey *)0x1f0ed7);
  }
  else {
    memset(local_2378,0xaa,0x30);
    ProString::ProString((ProString *)in_stack_ffffffffffffc800);
    QString::QString((QString *)in_stack_ffffffffffffc808,(char *)in_stack_ffffffffffffc838);
    bVar1 = QMakeProject::isActiveConfig
                      (in_stack_ffffffffffffc808,(QString *)in_stack_ffffffffffffc800,
                       SUB81((ulong)in_stack_ffffffffffffc7f8 >> 0x38,0));
    local_35f2 = 0;
    if (bVar1) {
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
      bVar1 = QMakeProject::isEmpty(in_stack_ffffffffffffc818,(ProKey *)in_stack_ffffffffffffc810);
      local_35f2 = bVar1 ^ 0xff;
      ProKey::~ProKey((ProKey *)0x1efb47);
    }
    QString::~QString((QString *)0x1efb54);
    if ((local_35f2 & 1) == 0) {
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
      QMakeEvaluator::first
                (&in_stack_ffffffffffffc818->super_QMakeEvaluator,
                 (ProKey *)in_stack_ffffffffffffc810);
      bVar1 = ProString::operator==
                        ((ProString *)in_stack_ffffffffffffc820,(char *)in_stack_ffffffffffffc818);
      local_3641 = false;
      if (bVar1) {
        QString::QString((QString *)in_stack_ffffffffffffc808,(char *)in_stack_ffffffffffffc838);
        local_3641 = QMakeProject::isActiveConfig
                               (in_stack_ffffffffffffc808,(QString *)in_stack_ffffffffffffc800,
                                SUB81((ulong)in_stack_ffffffffffffc7f8 >> 0x38,0));
        QString::~QString((QString *)0x1efeb1);
      }
      ProString::~ProString((ProString *)0x1efebe);
      ProKey::~ProKey((ProKey *)0x1efecb);
      if (local_3641 == false) {
        ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
        QMakeEvaluator::first
                  (&in_stack_ffffffffffffc818->super_QMakeEvaluator,
                   (ProKey *)in_stack_ffffffffffffc810);
        bVar5 = ProString::operator==
                          ((ProString *)in_stack_ffffffffffffc820,(char *)in_stack_ffffffffffffc818)
        ;
        bVar4 = false;
        bVar2 = false;
        bVar3 = false;
        bVar1 = false;
        local_309a = false;
        local_36b1 = false;
        if (bVar5) {
          QString::QString((QString *)in_stack_ffffffffffffc808,(char *)in_stack_ffffffffffffc838);
          bVar4 = true;
          bVar5 = QMakeProject::isActiveConfig
                            (in_stack_ffffffffffffc808,(QString *)in_stack_ffffffffffffc800,
                             SUB81((ulong)in_stack_ffffffffffffc7f8 >> 0x38,0));
          local_36b1 = false;
          if (!bVar5) {
            QString::QString((QString *)in_stack_ffffffffffffc808,(char *)in_stack_ffffffffffffc838)
            ;
            bVar2 = true;
            bVar5 = QMakeProject::isActiveConfig
                              (in_stack_ffffffffffffc808,(QString *)in_stack_ffffffffffffc800,
                               SUB81((ulong)in_stack_ffffffffffffc7f8 >> 0x38,0));
            if (bVar5) {
LAB_001f0438:
              QString::QString((QString *)in_stack_ffffffffffffc808,
                               (char *)in_stack_ffffffffffffc838);
              bVar1 = true;
              local_309a = QMakeProject::isActiveConfig
                                     (in_stack_ffffffffffffc808,(QString *)in_stack_ffffffffffffc800
                                      ,SUB81((ulong)in_stack_ffffffffffffc7f8 >> 0x38,0));
              local_36e1 = false;
              if (local_309a) {
                QString::QString((QString *)in_stack_ffffffffffffc808,
                                 (char *)in_stack_ffffffffffffc838);
                local_36e1 = QMakeProject::isActiveConfig
                                       (in_stack_ffffffffffffc808,
                                        (QString *)in_stack_ffffffffffffc800,
                                        SUB81((ulong)in_stack_ffffffffffffc7f8 >> 0x38,0));
              }
              local_36d1 = local_36e1;
            }
            else {
              QString::QString((QString *)in_stack_ffffffffffffc808,
                               (char *)in_stack_ffffffffffffc838);
              bVar3 = true;
              bVar5 = QMakeProject::isActiveConfig
                                (in_stack_ffffffffffffc808,(QString *)in_stack_ffffffffffffc800,
                                 SUB81((ulong)in_stack_ffffffffffffc7f8 >> 0x38,0));
              local_36d1 = true;
              if (!bVar5) goto LAB_001f0438;
            }
            local_36b1 = local_36d1;
          }
        }
        if (local_309a != false) {
          QString::~QString((QString *)0x1f0528);
        }
        if (bVar1) {
          QString::~QString((QString *)0x1f0541);
        }
        if (bVar3) {
          QString::~QString((QString *)0x1f055a);
        }
        if (bVar2) {
          QString::~QString((QString *)0x1f0573);
        }
        if (bVar4) {
          QString::~QString((QString *)0x1f058c);
        }
        ProString::~ProString((ProString *)0x1f0599);
        ProKey::~ProKey((ProKey *)0x1f05a6);
        if (local_36b1 != false) {
          ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
          QMakeEvaluator::first
                    (&in_stack_ffffffffffffc818->super_QMakeEvaluator,
                     (ProKey *)in_stack_ffffffffffffc810);
          ProString::operator=
                    ((ProString *)in_stack_ffffffffffffc800,(ProString *)in_stack_ffffffffffffc7f8);
          ProString::~ProString((ProString *)0x1f0620);
          ProKey::~ProKey((ProKey *)0x1f062d);
          QString::QString((QString *)in_stack_ffffffffffffc808,(char *)in_stack_ffffffffffffc838);
          bVar1 = QMakeProject::isActiveConfig
                            (in_stack_ffffffffffffc808,(QString *)in_stack_ffffffffffffc800,
                             SUB81((ulong)in_stack_ffffffffffffc7f8 >> 0x38,0));
          QString::~QString((QString *)0x1f0683);
          if (bVar1) {
            ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
            bVar1 = QMakeProject::isEmpty
                              (in_stack_ffffffffffffc818,(ProKey *)in_stack_ffffffffffffc810);
            ProKey::~ProKey((ProKey *)0x1f06e9);
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
              QMakeEvaluator::first
                        (&in_stack_ffffffffffffc818->super_QMakeEvaluator,
                         (ProKey *)in_stack_ffffffffffffc810);
              ProString::operator=
                        ((ProString *)in_stack_ffffffffffffc800,
                         (ProString *)in_stack_ffffffffffffc7f8);
              ProString::~ProString((ProString *)0x1f0760);
              ProKey::~ProKey((ProKey *)0x1f076d);
            }
            ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
            bVar1 = QMakeProject::isEmpty
                              (in_stack_ffffffffffffc818,(ProKey *)in_stack_ffffffffffffc810);
            ProKey::~ProKey((ProKey *)0x1f07c1);
            if (bVar1) {
              ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
              QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
              ProString::ProString
                        ((ProString *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc818);
              QList<ProString>::append
                        ((QList<ProString> *)in_stack_ffffffffffffc800,
                         (rvalue_ref)in_stack_ffffffffffffc7f8);
              ProString::~ProString((ProString *)0x1f084f);
              ProKey::~ProKey((ProKey *)0x1f085c);
            }
            ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
            QMakeEvaluator::first
                      (&in_stack_ffffffffffffc818->super_QMakeEvaluator,
                       (ProKey *)in_stack_ffffffffffffc810);
            bVar1 = ProString::endsWith(in_stack_ffffffffffffc838,
                                        (ProString *)in_stack_ffffffffffffc830,cs);
            bVar6 = bVar1 ^ 0xff;
            ProString::~ProString((ProString *)0x1f08d4);
            ProKey::~ProKey((ProKey *)0x1f08e1);
            if ((bVar6 & 1) != 0) {
              ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
              QMakeEvaluator::first
                        (&in_stack_ffffffffffffc818->super_QMakeEvaluator,
                         (ProKey *)in_stack_ffffffffffffc810);
              ProString::operator+=
                        ((ProString *)in_stack_ffffffffffffc800,
                         (ProString *)in_stack_ffffffffffffc7f8);
              ProString::~ProString((ProString *)0x1f0958);
              ProKey::~ProKey((ProKey *)0x1f0965);
            }
            ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
            bVar1 = QMakeProject::isEmpty
                              (in_stack_ffffffffffffc818,(ProKey *)in_stack_ffffffffffffc810);
            ProKey::~ProKey((ProKey *)0x1f09b9);
            if (bVar1) {
              ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
              QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
              ProString::ProString
                        ((ProString *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc818);
              QList<ProString>::append
                        ((QList<ProString> *)in_stack_ffffffffffffc800,
                         (rvalue_ref)in_stack_ffffffffffffc7f8);
              ProString::~ProString((ProString *)0x1f0a47);
              ProKey::~ProKey((ProKey *)0x1f0a54);
            }
          }
          else {
            ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
            bVar1 = QMakeProject::isEmpty
                              (in_stack_ffffffffffffc818,(ProKey *)in_stack_ffffffffffffc810);
            ProKey::~ProKey((ProKey *)0x1f0aa9);
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
              QMakeEvaluator::first
                        (&in_stack_ffffffffffffc818->super_QMakeEvaluator,
                         (ProKey *)in_stack_ffffffffffffc810);
              ProString::operator=
                        ((ProString *)in_stack_ffffffffffffc800,
                         (ProString *)in_stack_ffffffffffffc7f8);
              ProString::~ProString((ProString *)0x1f0b1a);
              ProKey::~ProKey((ProKey *)0x1f0b27);
            }
            ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
            bVar6 = QMakeProject::isEmpty
                              (in_stack_ffffffffffffc818,(ProKey *)in_stack_ffffffffffffc810);
            ProKey::~ProKey((ProKey *)0x1f0b72);
            if ((bVar6 & 1) != 0) {
              ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
              QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
              ProString::ProString
                        ((ProString *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc818);
              QList<ProString>::append
                        ((QList<ProString> *)in_stack_ffffffffffffc800,
                         (rvalue_ref)in_stack_ffffffffffffc7f8);
              ProString::~ProString((ProString *)0x1f0bee);
              ProKey::~ProKey((ProKey *)0x1f0bfb);
            }
            pQVar15 = (this->super_MakefileGenerator).project;
            ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
            QMakeEvaluator::first
                      (&in_stack_ffffffffffffc818->super_QMakeEvaluator,
                       (ProKey *)in_stack_ffffffffffffc810);
            bVar1 = ProString::endsWith((ProString *)pQVar15,(ProString *)in_stack_ffffffffffffc830,
                                        cs);
            ProString::~ProString((ProString *)0x1f0c6a);
            ProKey::~ProKey((ProKey *)0x1f0c77);
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
              QMakeEvaluator::first
                        (&in_stack_ffffffffffffc818->super_QMakeEvaluator,
                         (ProKey *)in_stack_ffffffffffffc810);
              ProString::operator+=
                        ((ProString *)in_stack_ffffffffffffc800,
                         (ProString *)in_stack_ffffffffffffc7f8);
              ProString::~ProString((ProString *)0x1f0ce5);
              ProKey::~ProKey((ProKey *)0x1f0cf2);
            }
          }
        }
      }
      else {
        ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
        QMakeEvaluator::first
                  (&in_stack_ffffffffffffc818->super_QMakeEvaluator,
                   (ProKey *)in_stack_ffffffffffffc810);
        ProString::operator=
                  ((ProString *)in_stack_ffffffffffffc800,(ProString *)in_stack_ffffffffffffc7f8);
        ProString::~ProString((ProString *)0x1eff45);
        ProKey::~ProKey((ProKey *)0x1eff52);
        ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
        bVar1 = QMakeProject::isEmpty(in_stack_ffffffffffffc818,(ProKey *)in_stack_ffffffffffffc810)
        ;
        ProKey::~ProKey((ProKey *)0x1effa8);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
          QMakeEvaluator::first
                    (&in_stack_ffffffffffffc818->super_QMakeEvaluator,
                     (ProKey *)in_stack_ffffffffffffc810);
          ProString::operator=
                    ((ProString *)in_stack_ffffffffffffc800,(ProString *)in_stack_ffffffffffffc7f8);
          ProString::~ProString((ProString *)0x1f001f);
          ProKey::~ProKey((ProKey *)0x1f002c);
        }
        bVar1 = ProString::endsWith((ProString *)in_stack_ffffffffffffc810,
                                    (char *)in_stack_ffffffffffffc808,
                                    (CaseSensitivity)((ulong)in_stack_ffffffffffffc800 >> 0x20));
        if (!bVar1) {
          ProString::operator+=
                    ((ProString *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
        }
        ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
        bVar1 = QMakeProject::isEmpty(in_stack_ffffffffffffc818,(ProKey *)in_stack_ffffffffffffc810)
        ;
        ProKey::~ProKey((ProKey *)0x1f00b1);
        if (bVar1) {
          ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
          QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
          ProString::ProString
                    ((ProString *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc818);
          QList<ProString>::append
                    ((QList<ProString> *)in_stack_ffffffffffffc800,
                     (rvalue_ref)in_stack_ffffffffffffc7f8);
          ProString::~ProString((ProString *)0x1f013f);
          ProKey::~ProKey((ProKey *)0x1f014c);
        }
        ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
        QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
        ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
        QMakeEvaluator::first
                  (&in_stack_ffffffffffffc818->super_QMakeEvaluator,
                   (ProKey *)in_stack_ffffffffffffc810);
        ::operator+((ProString *)in_stack_ffffffffffffc808,(ProString *)in_stack_ffffffffffffc800);
        ::operator+((QStringBuilder<ProString,_ProString_&> *)in_stack_ffffffffffffc808,
                    (char (*) [18])in_stack_ffffffffffffc800);
        ProString::ProString<QStringBuilder<ProString,ProString&>,char_const(&)[18]>
                  ((ProString *)in_stack_ffffffffffffc810,
                   (QStringBuilder<QStringBuilder<ProString,_ProString_&>,_const_char_(&)[18]> *)
                   in_stack_ffffffffffffc808);
        QList<ProString>::append
                  ((QList<ProString> *)in_stack_ffffffffffffc800,
                   (rvalue_ref)in_stack_ffffffffffffc7f8);
        ProString::~ProString((ProString *)0x1f024f);
        QStringBuilder<QStringBuilder<ProString,_ProString_&>,_const_char_(&)[18]>::~QStringBuilder
                  ((QStringBuilder<QStringBuilder<ProString,_ProString_&>,_const_char_(&)[18]> *)
                   0x1f025c);
        QStringBuilder<ProString,_ProString_&>::~QStringBuilder
                  ((QStringBuilder<ProString,_ProString_&> *)0x1f0269);
        ProString::~ProString((ProString *)0x1f0276);
        ProKey::~ProKey((ProKey *)0x1f0283);
        ProKey::~ProKey((ProKey *)0x1f0290);
      }
    }
    else {
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
      QMakeEvaluator::first
                (&in_stack_ffffffffffffc818->super_QMakeEvaluator,
                 (ProKey *)in_stack_ffffffffffffc810);
      ProString::operator=
                ((ProString *)in_stack_ffffffffffffc800,(ProString *)in_stack_ffffffffffffc7f8);
      ProString::~ProString((ProString *)0x1efbce);
      ProKey::~ProKey((ProKey *)0x1efbdb);
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
      bVar1 = QMakeProject::isEmpty(in_stack_ffffffffffffc818,(ProKey *)in_stack_ffffffffffffc810);
      ProKey::~ProKey((ProKey *)0x1efc31);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
        QMakeEvaluator::first
                  (&in_stack_ffffffffffffc818->super_QMakeEvaluator,
                   (ProKey *)in_stack_ffffffffffffc810);
        ProString::operator=
                  ((ProString *)in_stack_ffffffffffffc800,(ProString *)in_stack_ffffffffffffc7f8);
        ProString::~ProString((ProString *)0x1efca8);
        ProKey::~ProKey((ProKey *)0x1efcb5);
      }
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
      QMakeEvaluator::first
                (&in_stack_ffffffffffffc818->super_QMakeEvaluator,
                 (ProKey *)in_stack_ffffffffffffc810);
      bVar1 = ProString::endsWith(in_stack_ffffffffffffc838,(ProString *)in_stack_ffffffffffffc830,
                                  cs);
      ProString::~ProString((ProString *)0x1efd2d);
      ProKey::~ProKey((ProKey *)0x1efd3a);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
        QMakeEvaluator::first
                  (&in_stack_ffffffffffffc818->super_QMakeEvaluator,
                   (ProKey *)in_stack_ffffffffffffc810);
        ProString::operator+=
                  ((ProString *)in_stack_ffffffffffffc800,(ProString *)in_stack_ffffffffffffc7f8);
        ProString::~ProString((ProString *)0x1efdb1);
        ProKey::~ProKey((ProKey *)0x1efdbe);
      }
    }
    bVar1 = ProString::isEmpty(local_2378);
    if (bVar1) {
      in_stack_ffffffffffffc818 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
      QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
      QList<ProString>::clear((QList<ProString> *)in_stack_ffffffffffffc800);
      ProKey::~ProKey((ProKey *)0x1f0dd8);
      in_stack_ffffffffffffc820 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
      QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
      QList<ProString>::clear((QList<ProString> *)in_stack_ffffffffffffc800);
      ProKey::~ProKey((ProKey *)0x1f0e27);
    }
    else {
      ProStringList::ProStringList
                ((ProStringList *)in_stack_ffffffffffffc800,(ProString *)in_stack_ffffffffffffc7f8);
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffc800,(char *)in_stack_ffffffffffffc7f8);
      QMakeProject::values(in_stack_ffffffffffffc800,(ProKey *)in_stack_ffffffffffffc7f8);
      ProStringList::operator=
                ((ProStringList *)in_stack_ffffffffffffc800,
                 (ProStringList *)in_stack_ffffffffffffc7f8);
      ProKey::~ProKey((ProKey *)0x1f0d77);
      ProStringList::~ProStringList((ProStringList *)0x1f0d84);
    }
    ProString::~ProString((ProString *)0x1f0e34);
  }
  init2(in_stack_ffffffffffffd1f8);
  memset(local_2f78,0xaa,0x30);
  pQVar15 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)pQVar15,(char *)in_stack_ffffffffffffc7f8);
  QMakeEvaluator::first
            (&in_stack_ffffffffffffc818->super_QMakeEvaluator,(ProKey *)in_stack_ffffffffffffc810);
  ProKey::~ProKey((ProKey *)0x1f0f4a);
  iVar8 = ProString::lastIndexOf
                    ((ProString *)in_stack_ffffffffffffc820,(QString *)in_stack_ffffffffffffc818,
                     (int)((ulong)in_stack_ffffffffffffc810 >> 0x20),
                     (CaseSensitivity)in_stack_ffffffffffffc810);
  if (iVar8 != -1) {
    ProString::chopFront(local_2f78,iVar8 + 1);
  }
  t = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)pQVar15,(char *)t);
  QMakeProject::values(pQVar15,(ProKey *)t);
  QList<ProString>::prepend((QList<ProString> *)pQVar15,(parameter_type)t);
  ProKey::~ProKey((ProKey *)0x1f0fe5);
  ProString::~ProString((ProString *)0x1f0ff2);
  ProStringList::~ProStringList((ProStringList *)0x1f0fff);
  ProStringList::~ProStringList((ProStringList *)0x1f100c);
LAB_001f1017:
  QString::~QString((QString *)0x1f1024);
  QList<QString>::~QList((QList<QString> *)0x1f1031);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void
UnixMakefileGenerator::init()
{
    ProStringList &configs = project->values("CONFIG");
    if(project->isEmpty("ICON") && !project->isEmpty("RC_FILE"))
        project->values("ICON") = project->values("RC_FILE");
    if(project->isEmpty("QMAKE_EXTENSION_PLUGIN"))
        project->values("QMAKE_EXTENSION_PLUGIN").append(project->first("QMAKE_EXTENSION_SHLIB"));

    project->values("QMAKE_ORIG_TARGET") = project->values("TARGET");

    //version handling
    if (project->isEmpty("VERSION")) {
        project->values("VERSION").append(
            "1.0." + (project->isEmpty("VER_PAT") ? QString("0") : project->first("VER_PAT")));
    }
    QStringList l = project->first("VERSION").toQString().split('.');
    l << "0" << "0"; //make sure there are three
    project->values("VER_MAJ").append(l[0]);
    project->values("VER_MIN").append(l[1]);
    project->values("VER_PAT").append(l[2]);

    QString sroot = project->sourceRoot();
    for (const ProString &iif : project->values("QMAKE_INTERNAL_INCLUDED_FILES")) {
        if (iif == project->cacheFile())
            continue;
        if (iif.startsWith(sroot) && iif.at(sroot.size()) == QLatin1Char('/'))
            project->values("DISTFILES") += fileFixify(iif.toQString(), FileFixifyRelative);
    }

    /* this should probably not be here, but I'm using it to wrap the .t files */
    if(project->first("TEMPLATE") == "app")
        project->values("QMAKE_APP_FLAG").append("1");
    else if(project->first("TEMPLATE") == "lib")
        project->values("QMAKE_LIB_FLAG").append("1");
    else if(project->first("TEMPLATE") == "subdirs") {
        MakefileGenerator::init();
        if(project->isEmpty("MAKEFILE"))
            project->values("MAKEFILE").append("Makefile");
        return; /* subdirs is done */
    }

    project->values("QMAKE_ORIG_DESTDIR") = project->values("DESTDIR");
    if((!project->isEmpty("QMAKE_LIB_FLAG") && !project->isActiveConfig("staticlib")) ||
       (project->isActiveConfig("qt") &&  project->isActiveConfig("plugin"))) {
        if(configs.indexOf("dll") == -1) configs.append("dll");
    } else if(!project->isEmpty("QMAKE_APP_FLAG") || project->isActiveConfig("dll")) {
        configs.removeAll("staticlib");
    }
    if(!project->isEmpty("QMAKE_INCREMENTAL"))
        project->values("QMAKE_LFLAGS") += project->values("QMAKE_LFLAGS_INCREMENTAL");
    else if(!project->isEmpty("QMAKE_LFLAGS_PREBIND") &&
            !project->values("QMAKE_LIB_FLAG").isEmpty() &&
            project->isActiveConfig("dll"))
        project->values("QMAKE_LFLAGS") += project->values("QMAKE_LFLAGS_PREBIND");
    project->values("QMAKE_INCDIR") += project->values("QMAKE_INCDIR_POST");
    project->values("QMAKE_RPATHDIR") += project->values("QMAKE_RPATHDIR_POST");
    project->values("QMAKE_RPATHLINKDIR") += project->values("QMAKE_RPATHLINKDIR_POST");
    if(!project->isEmpty("QMAKE_INCDIR"))
        project->values("INCLUDEPATH") += project->values("QMAKE_INCDIR");
    // The order of the next two lines is relevant due to side effect on QMAKE_LFLAGS.
    ProStringList ldadd = project->values("QMAKE_LIBDIR_FLAGS") + libdirToFlags("QMAKE_LIBDIR");
    ProStringList ldaddpost = libdirToFlags("QMAKE_LIBDIR_POST");
    if (project->isActiveConfig("mac")) {
        if (!project->isEmpty("QMAKE_FRAMEWORKPATH")) {
            const ProStringList &fwdirs = project->values("QMAKE_FRAMEWORKPATH");
            for (int i = 0; i < fwdirs.size(); ++i)
                project->values("QMAKE_FRAMEWORKPATH_FLAGS") += "-F" + escapeFilePath(fwdirs[i]);
        }
        ldadd += project->values("QMAKE_FRAMEWORKPATH_FLAGS");
    }
    ProStringList &qmklibs = project->values("LIBS");
    qmklibs = ldadd + qmklibs;
    ProStringList &qmklibspost = project->values("QMAKE_LIBS");
    qmklibspost = ldaddpost + qmklibspost;
    if (!project->isEmpty("QMAKE_RPATHDIR") && !project->isEmpty("QMAKE_LFLAGS_RPATH")) {
        const ProStringList &rpathdirs = project->values("QMAKE_RPATHDIR");
        for (int i = 0; i < rpathdirs.size(); ++i) {
            QString rpathdir = rpathdirs[i].toQString();
            if (rpathdir.size() > 1 && rpathdir.at(0) == '$' && rpathdir.at(1) != '(') {
                rpathdir.replace(0, 1, "\\$$");  // Escape from make and the shell
            } else if (!rpathdir.startsWith('@') && fileInfo(rpathdir).isRelative()) {
                QString rpathbase = project->first("QMAKE_REL_RPATH_BASE").toQString();
                if (rpathbase.isEmpty()) {
                    fprintf(stderr, "Error: This platform does not support relative paths in QMAKE_RPATHDIR (%s)\n",
                                    rpathdir.toLatin1().constData());
                    continue;
                }
                if (rpathbase.startsWith('$'))
                    rpathbase.replace(0, 1, "\\$$");  // Escape from make and the shell
                if (rpathdir == ".")
                    rpathdir = rpathbase;
                else
                    rpathdir.prepend(rpathbase + '/');
                project->values("QMAKE_LFLAGS").insertUnique(project->values("QMAKE_LFLAGS_REL_RPATH"));
            }
            project->values("QMAKE_LFLAGS") += var("QMAKE_LFLAGS_RPATH") + escapeFilePath(rpathdir);
        }
    }
    if (!project->isEmpty("QMAKE_RPATHLINKDIR")) {
        const ProStringList &rpathdirs = project->values("QMAKE_RPATHLINKDIR");
        for (int i = 0; i < rpathdirs.size(); ++i) {
            if (!project->isEmpty("QMAKE_LFLAGS_RPATHLINK"))
                project->values("QMAKE_LFLAGS") += var("QMAKE_LFLAGS_RPATHLINK") + escapeFilePath(QFileInfo(rpathdirs[i].toQString()).absoluteFilePath());
        }
    }

    if(project->isActiveConfig("GNUmake") && !project->isEmpty("QMAKE_CFLAGS_DEPS"))
        include_deps = true; //do not generate deps

    MakefileGenerator::init();

    if (project->isActiveConfig("objective_c"))
        project->values("QMAKE_BUILTIN_COMPILERS") << "OBJC" << "OBJCXX";

    for (const ProString &compiler : project->values("QMAKE_BUILTIN_COMPILERS")) {
        QString compile_flag = var("QMAKE_COMPILE_FLAG");
        if(compile_flag.isEmpty())
            compile_flag = "-c";

        if(doPrecompiledHeaders() && !project->isEmpty("PRECOMPILED_HEADER")) {
            QString pchFlags = var(ProKey("QMAKE_" + compiler + "FLAGS_USE_PRECOMPILE"));

            QString pchBaseName;
            if(!project->isEmpty("PRECOMPILED_DIR")) {
                pchBaseName = Option::fixPathToTargetOS(project->first("PRECOMPILED_DIR").toQString());
                if(!pchBaseName.endsWith(Option::dir_sep))
                    pchBaseName += Option::dir_sep;
            }
            pchBaseName += project->first("QMAKE_ORIG_TARGET").toQString();

            // replace place holders
            pchFlags.replace(QLatin1String("${QMAKE_PCH_INPUT}"),
                             escapeFilePath(project->first("PRECOMPILED_HEADER").toQString()));
            pchFlags.replace(QLatin1String("${QMAKE_PCH_OUTPUT_BASE}"), escapeFilePath(pchBaseName));
            if (project->isActiveConfig("icc_pch_style")) {
                // icc style
                pchFlags.replace(QLatin1String("${QMAKE_PCH_OUTPUT}"),
                                 escapeFilePath(pchBaseName + project->first("QMAKE_PCH_OUTPUT_EXT")));
                const ProStringList pchArchs = project->values("QMAKE_PCH_ARCHS");
                for (const ProString &arch : pchArchs) {
                    QString suffix = project->first("QMAKE_PCH_OUTPUT_EXT").toQString();
                    suffix.replace(QLatin1String("${QMAKE_PCH_ARCH}"), arch.toQString());
                    pchFlags.replace(QLatin1String("${QMAKE_PCH_OUTPUT_") + arch + QLatin1Char('}'),
                                     escapeFilePath(pchBaseName + suffix));
                }
            } else {
                // gcc style (including clang_pch_style)
                QString headerSuffix;
                if (project->isActiveConfig("clang_pch_style"))
                    headerSuffix = project->first("QMAKE_PCH_OUTPUT_EXT").toQString();

                pchBaseName += project->first("QMAKE_PCH_OUTPUT_EXT").toQString();
                pchBaseName += Option::dir_sep;

                ProString language = project->first(ProKey("QMAKE_LANGUAGE_" + compiler));
                if (!language.isEmpty()) {
                    pchFlags.replace(QLatin1String("${QMAKE_PCH_OUTPUT}"),
                                     escapeFilePath(pchBaseName + language + headerSuffix));
                    const ProStringList pchArchs = project->values("QMAKE_PCH_ARCHS");
                    for (const ProString &arch : pchArchs) {
                        QString file = pchBaseName + language + headerSuffix;
                        file.replace(QLatin1String("${QMAKE_PCH_ARCH}"), arch.toQString());
                        if (project->isActiveConfig("clang_pch_style")
                            && (file.endsWith(QLatin1String(".pch"))
                                || file.endsWith(QLatin1String(".gch")))) {
                            file.chop(4); // must omit header suffix for -include to recognize the PCH
                        }
                        pchFlags.replace(QLatin1String("${QMAKE_PCH_OUTPUT_") + arch + QLatin1Char('}'),
                                         escapeFilePath(file));
                    }
                }
            }

            if (!pchFlags.isEmpty())
                compile_flag += " " + pchFlags;
        }

        QString compilerExecutable;
        if (compiler == "C" || compiler == "OBJC") {
            compilerExecutable = "$(CC)";
            compile_flag += " $(CFLAGS)";
        } else {
            compilerExecutable = "$(CXX)";
            compile_flag += " $(CXXFLAGS)";
        }

        compile_flag += " $(INCPATH)";

        ProString compilerVariable = compiler;
        if (compilerVariable == "C")
            compilerVariable = ProString("CC");

        const ProKey runComp("QMAKE_RUN_" + compilerVariable);
        if(project->isEmpty(runComp))
            project->values(runComp).append(compilerExecutable + " " + compile_flag + " " + var("QMAKE_CC_O_FLAG") + "$obj $src");
        const ProKey runCompImp("QMAKE_RUN_" + compilerVariable + "_IMP");
        if(project->isEmpty(runCompImp))
            project->values(runCompImp).append(compilerExecutable + " " + compile_flag + " " + var("QMAKE_CC_O_FLAG") + "\"$@\" \"$<\"");
    }

    if (project->isActiveConfig("mac") && !project->isEmpty("TARGET") &&
       ((project->isActiveConfig("build_pass") || project->isEmpty("BUILDS")))) {
        ProString bundle;
        if(project->isActiveConfig("bundle") && !project->isEmpty("QMAKE_BUNDLE_EXTENSION")) {
            bundle = project->first("TARGET");
            if(!project->isEmpty("QMAKE_BUNDLE_NAME"))
                bundle = project->first("QMAKE_BUNDLE_NAME");
            if(!bundle.endsWith(project->first("QMAKE_BUNDLE_EXTENSION")))
                bundle += project->first("QMAKE_BUNDLE_EXTENSION");
        } else if(project->first("TEMPLATE") == "app" && project->isActiveConfig("app_bundle")) {
            bundle = project->first("TARGET");
            if(!project->isEmpty("QMAKE_APPLICATION_BUNDLE_NAME"))
                bundle = project->first("QMAKE_APPLICATION_BUNDLE_NAME");
            if(!bundle.endsWith(".app"))
                bundle += ".app";
            if(project->isEmpty("QMAKE_BUNDLE_LOCATION"))
                project->values("QMAKE_BUNDLE_LOCATION").append("Contents/MacOS");
            project->values("QMAKE_PKGINFO").append(project->first("DESTDIR") + bundle + "/Contents/PkgInfo");
        } else if(project->first("TEMPLATE") == "lib" && !project->isActiveConfig("staticlib") &&
                  ((!project->isActiveConfig("plugin") && project->isActiveConfig("lib_bundle")) ||
                   (project->isActiveConfig("plugin") && project->isActiveConfig("plugin_bundle")))) {
            bundle = project->first("TARGET");
            if(project->isActiveConfig("plugin")) {
                if(!project->isEmpty("QMAKE_PLUGIN_BUNDLE_NAME"))
                    bundle = project->first("QMAKE_PLUGIN_BUNDLE_NAME");
                if (project->isEmpty("QMAKE_BUNDLE_EXTENSION"))
                    project->values("QMAKE_BUNDLE_EXTENSION").append(".plugin");
                if (!bundle.endsWith(project->first("QMAKE_BUNDLE_EXTENSION")))
                    bundle += project->first("QMAKE_BUNDLE_EXTENSION");
                if(project->isEmpty("QMAKE_BUNDLE_LOCATION"))
                    project->values("QMAKE_BUNDLE_LOCATION").append("Contents/MacOS");
            } else {
                if(!project->isEmpty("QMAKE_FRAMEWORK_BUNDLE_NAME"))
                    bundle = project->first("QMAKE_FRAMEWORK_BUNDLE_NAME");
                if (project->isEmpty("QMAKE_BUNDLE_EXTENSION"))
                    project->values("QMAKE_BUNDLE_EXTENSION").append(".framework");
                if (!bundle.endsWith(project->first("QMAKE_BUNDLE_EXTENSION")))
                    bundle += project->first("QMAKE_BUNDLE_EXTENSION");
            }
        }
        if(!bundle.isEmpty()) {
            project->values("QMAKE_BUNDLE") = ProStringList(bundle);
        } else {
            project->values("QMAKE_BUNDLE").clear();
            project->values("QMAKE_BUNDLE_LOCATION").clear();
        }
    } else { //no bundling here
        project->values("QMAKE_BUNDLE").clear();
        project->values("QMAKE_BUNDLE_LOCATION").clear();
    }

    init2();
    ProString target = project->first("TARGET");
    int slsh = target.lastIndexOf(Option::dir_sep);
    if (slsh != -1)
        target.chopFront(slsh + 1);
    project->values("LIB_TARGET").prepend(target);
}